

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  ImBitVector *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ImWchar IVar6;
  undefined2 uVar7;
  uint uVar8;
  ImFont *pIVar9;
  ImFont *pIVar10;
  undefined8 *puVar11;
  ImFontConfig *pIVar12;
  char cVar13;
  char cVar18;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [14];
  undefined1 auVar43 [16];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  stbtt__buf fontdict;
  undefined1 auVar48 [15];
  unkuint9 Var49;
  undefined1 auVar50 [15];
  undefined1 auVar51 [13];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [15];
  unkbyte10 Var56;
  uint6 uVar57;
  undefined1 auVar58 [14];
  undefined1 auVar59 [16];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  stbtt__active_edge **ppsVar62;
  bool bVar63;
  ushort uVar64;
  ushort uVar65;
  short sVar66;
  stbtt_uint32 sVar67;
  uint uVar75;
  int iVar76;
  int iVar77;
  void *p;
  ulong uVar78;
  stbtt_uint32 sVar68;
  stbtt_uint32 sVar69;
  stbtt_uint32 sVar70;
  stbtt_uint32 sVar71;
  stbtt_uint32 sVar72;
  stbtt_uint32 sVar73;
  stbtt_uint32 sVar74;
  int *piVar79;
  void *pvVar80;
  void *pvVar81;
  stbrp_context *ptr;
  uchar *puVar82;
  stbtt__buf *scanline;
  undefined1 auVar83 [8];
  undefined8 *puVar84;
  stbtt__active_edge *psVar85;
  stbtt__buf *psVar86;
  bool bVar87;
  short sVar88;
  uint uVar89;
  uint uVar90;
  long lVar91;
  ImWchar *pIVar92;
  char *__function;
  int iVar93;
  ulong uVar94;
  long lVar95;
  bool bVar96;
  long lVar97;
  stbtt_fontinfo *psVar98;
  ImFontConfig *pIVar99;
  size_t sVar100;
  float fVar101;
  ushort *puVar102;
  stbtt__edge *psVar103;
  ulong uVar104;
  ulong uVar105;
  uint *ptr_00;
  stbrp_node **ppsVar106;
  byte *pbVar107;
  long lVar108;
  stbtt__edge *psVar109;
  uint uVar110;
  int iVar111;
  int iVar112;
  byte *pbVar113;
  ImFontAtlas *atlas_00;
  ImU32 bit_n;
  uint uVar114;
  long lVar115;
  byte bVar116;
  char cVar123;
  char cVar124;
  char cVar126;
  ushort uVar125;
  short sVar127;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar128;
  uint uVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar134;
  undefined1 auVar132 [16];
  uint uVar135;
  uint uVar139;
  undefined1 auVar136 [16];
  uint uVar140;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint uVar141;
  uint uVar145;
  undefined1 in_XMM3 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  uint uVar146;
  undefined1 auVar144 [16];
  float fVar153;
  float fVar154;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar155;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  int iVar156;
  float fVar157;
  float fVar162;
  uint uVar163;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  short sVar166;
  float fVar167;
  float fVar175;
  uint uVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar173 [16];
  float fVar179;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  short sVar186;
  uint uVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  stbtt__buf sVar203;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  void *local_4d8;
  undefined4 in_stack_fffffffffffffb34;
  uint *puVar204;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  ImFontAtlas *local_478;
  ulong local_470;
  undefined1 local_468 [16];
  ImFontConfig *local_450;
  undefined1 local_448 [8];
  stbrp_node *local_440;
  stbtt__edge *local_438;
  float local_42c;
  ulong local_428;
  void *local_420;
  stbtt__active_edge *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  undefined1 local_3f8 [8];
  void *pvStack_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d0;
  int local_3c8;
  float local_3c4;
  long local_3c0;
  stbtt_fontinfo *local_3b8;
  undefined8 *local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  long local_378;
  float *local_370;
  int local_368;
  uint local_364;
  uint local_360;
  float local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  undefined1 local_348 [16];
  stbrp_context *local_330;
  float *local_328;
  ulong local_320;
  ulong local_318;
  size_t local_310;
  ImFontConfig *local_308;
  long local_300;
  size_t local_2f8;
  size_t local_2f0;
  uchar *local_2e8;
  long local_2e0;
  short *local_2d8;
  long local_2d0;
  stbtt__edge *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined4 uVar168;
  undefined6 uVar169;
  undefined8 uVar170;
  undefined1 auVar171 [12];
  undefined1 auVar172 [14];
  undefined1 auVar174 [16];
  undefined4 uVar187;
  undefined6 uVar188;
  undefined8 uVar189;
  undefined1 auVar190 [12];
  undefined1 auVar191 [14];
  undefined1 auVar195 [16];
  
  local_3e8._8_8_ = local_3e8._0_8_;
  local_498._8_8_ = local_498._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                  ,0x929,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4d8 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar8 = (atlas->ConfigData).Size;
  lVar91 = (long)(int)uVar8;
  if (0 < lVar91) {
    uVar78 = 8;
    if (8 < uVar8) {
      uVar78 = (ulong)uVar8;
    }
    local_4d8 = ImGui::MemAlloc(uVar78 * 0x110);
  }
  uVar110 = (atlas->Fonts).Size;
  iVar76 = (int)uVar110 >> 0x1f;
  if ((int)uVar110 < 1) {
    local_498._0_8_ = (void *)0x0;
  }
  else {
    uVar78 = 8;
    if (8 < uVar110) {
      uVar78 = (ulong)uVar110;
    }
    local_498._0_8_ = ImGui::MemAlloc(uVar78 << 5);
  }
  local_310 = lVar91 * 0x110;
  memset(local_4d8,0,local_310);
  local_3e8._0_8_ = CONCAT44(iVar76,uVar110) << 5;
  memset((void *)local_498._0_8_,0,local_3e8._0_8_);
  local_478 = atlas;
  if (0 < (atlas->ConfigData).Size) {
    uVar78 = 0;
    if (0 < (int)uVar8) {
      uVar78 = (ulong)uVar8;
    }
    local_348._0_8_ = uVar78;
    lVar108 = 0;
    do {
      if (lVar108 == local_348._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0015a97b;
      }
      pIVar99 = (local_478->ConfigData).Data;
      pIVar9 = pIVar99[lVar108].DstFont;
      if ((pIVar9 == (ImFont *)0x0) ||
         (pIVar9->ContainerAtlas != local_478 && pIVar9->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x941,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_4d8 + lVar108 * 0x110 + 0xe0) = 0xffffffff;
      uVar78 = (ulong)(local_478->Fonts).Size;
      if ((long)uVar78 < 1) {
LAB_0015a9c3:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x94a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar99 = pIVar99 + lVar108;
      uVar94 = 0;
      while (pIVar10 = (local_478->Fonts).Data[uVar94], pIVar9 != pIVar10) {
        uVar94 = uVar94 + 1;
        if ((uVar78 <= uVar94) || (pIVar9 == pIVar10)) goto LAB_0015a9c3;
      }
      *(int *)((long)local_4d8 + lVar108 * 0x110 + 0xe0) = (int)uVar94;
      pbVar113 = (byte *)pIVar99->FontData;
      iVar93 = pIVar99->FontNo;
      bVar116 = *pbVar113;
      local_450 = pIVar99;
      if (bVar116 < 0x4f) {
        if (bVar116 == 0) {
          if (pbVar113[1] != 1) goto LAB_0015aa59;
        }
        else if ((bVar116 != 0x31) || (pbVar113[1] != 0)) goto LAB_0015aa59;
        if ((pbVar113[2] != 0) || (pbVar113[3] != 0)) goto LAB_0015aa59;
LAB_001574ba:
        sVar74 = -(uint)(iVar93 != 0);
      }
      else {
        if (bVar116 == 0x4f) {
          if (((pbVar113[1] != 0x54) || (pbVar113[2] != 0x54)) || (pbVar113[3] != 0x4f))
          goto LAB_0015aa59;
          goto LAB_001574ba;
        }
        if (bVar116 != 0x74) goto LAB_0015aa59;
        bVar116 = pbVar113[1];
        if (bVar116 == 0x72) {
          if ((pbVar113[2] != 0x75) || (pbVar113[3] != 0x65)) goto LAB_0015aa59;
          goto LAB_001574ba;
        }
        if (bVar116 != 0x74) {
          if (((bVar116 != 0x79) || (pbVar113[2] != 0x70)) || (pbVar113[3] != 0x31))
          goto LAB_0015aa59;
          goto LAB_001574ba;
        }
        if ((pbVar113[2] != 99) || (pbVar113[3] != 0x66)) goto LAB_0015aa59;
        uVar75 = *(uint *)(pbVar113 + 4);
        uVar75 = uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
        ;
        if (((uVar75 != 0x20000) && (uVar75 != 0x10000)) ||
           (uVar75 = *(uint *)(pbVar113 + 8),
           (int)(uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
                ) <= iVar93)) goto LAB_0015aa59;
        uVar75 = *(uint *)(pbVar113 + (long)iVar93 * 4 + 0xc);
        sVar74 = uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
        ;
      }
      if ((int)sVar74 < 0) {
LAB_0015aa59:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x94f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)local_4d8 + lVar108 * 0x110 + 8) = pbVar113;
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x10) = sVar74;
      *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x48) = 0;
      sVar67 = stbtt__find_table(pbVar113,sVar74,"cmap");
      sVar68 = stbtt__find_table(pbVar113,sVar74,"loca");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x18) = sVar68;
      sVar69 = stbtt__find_table(pbVar113,sVar74,"head");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x1c) = sVar69;
      sVar70 = stbtt__find_table(pbVar113,sVar74,"glyf");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x20) = sVar70;
      sVar71 = stbtt__find_table(pbVar113,sVar74,"hhea");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x24) = sVar71;
      sVar72 = stbtt__find_table(pbVar113,sVar74,"hmtx");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x28) = sVar72;
      sVar73 = stbtt__find_table(pbVar113,sVar74,"kern");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x2c) = sVar73;
      local_488._0_4_ = sVar74;
      sVar74 = stbtt__find_table(pbVar113,sVar74,"GPOS");
      *(stbtt_uint32 *)((long)local_4d8 + lVar108 * 0x110 + 0x30) = sVar74;
      if ((((sVar67 == 0) || (sVar69 == 0)) || (sVar71 == 0)) || (sVar72 == 0)) {
LAB_00157cd3:
        if ((void *)local_498._0_8_ != (void *)0x0) {
          ImGui::MemFree((void *)local_498._0_8_);
        }
        if (local_4d8 != (void *)0x0) {
          ImGui::MemFree(local_4d8);
        }
        return false;
      }
      if (sVar70 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
        local_410._0_4_ = 0;
        local_49c = 0;
        sVar74 = stbtt__find_table(pbVar113,local_488._0_4_,"CFF ");
        if (sVar74 == 0) goto LAB_00157cd3;
        *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x88) = 0;
        *(byte **)((long)local_4d8 + lVar108 * 0x110 + 0x40) = pbVar113 + sVar74;
        *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x48) = 0x2000000000000000;
        local_238[0].data = *(uchar **)((long)local_4d8 + lVar108 * 0x110 + 0x40);
        local_238[0]._8_8_ = *(undefined8 *)((long)local_4d8 + lVar108 * 0x110 + 0x48);
        if (local_238[0].cursor < -2) {
LAB_0015ab42:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        uVar75 = local_238[0].cursor + 2;
        if (local_238[0].size < (int)uVar75) goto LAB_0015ab42;
        uVar114 = 0;
        if ((int)uVar75 < local_238[0].size) {
          uVar114 = (uint)local_238[0].data[uVar75];
        }
        if (local_238[0].size < (int)uVar114) goto LAB_0015ab42;
        local_238[0].cursor = uVar114;
        stbtt__cff_get_index(local_238);
        sVar203 = stbtt__cff_get_index(local_238);
        _local_3f8 = stbtt__cff_index_get(sVar203,0);
        stbtt__cff_get_index(local_238);
        sVar203 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4d8 + lVar108 * 0x110 + 0x60) = sVar203;
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x11,1,(stbtt_uint32 *)local_448);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x106,1,(stbtt_uint32 *)&local_3a8);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x124,1,(stbtt_uint32 *)&local_410);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x125,1,&local_49c);
        uVar170 = local_238[0]._8_8_;
        sVar203._4_12_ = in_stack_fffffffffffffb0c;
        sVar203.data._0_4_ = in_stack_fffffffffffffb08;
        fontdict.data._4_4_ = in_stack_fffffffffffffb34;
        fontdict.data._0_4_ = sVar70;
        fontdict.cursor = uVar110;
        fontdict.size = iVar76;
        sVar203 = stbtt__get_subrs(sVar203,fontdict);
        sVar74 = local_49c;
        *(stbtt__buf *)((long)local_4d8 + lVar108 * 0x110 + 0x70) = sVar203;
        if (((stbtt_uint32)local_3a8 != 2) || (uVar168 = local_448._0_4_, local_448._0_4_ == 0))
        goto LAB_00157cd3;
        iVar93 = SUB84(uVar170,4);
        if ((stbtt_uint32)local_410 != 0) {
          uVar78 = (ulong)local_49c;
          if (uVar78 == 0) goto LAB_00157cd3;
          if (((int)(stbtt_uint32)local_410 < 0) ||
             (SUB84(uVar170,4) < (int)(stbtt_uint32)local_410)) goto LAB_0015ab42;
          local_238[0].cursor = (stbtt_uint32)local_410;
          sVar203 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)local_4d8 + lVar108 * 0x110 + 0x80) = sVar203;
          puVar82 = local_238[0].data + uVar78;
          lVar115 = (ulong)(local_238[0].size - sVar74) << 0x20;
          if ((int)(local_238[0].size - sVar74 | sVar74) < 0 || local_238[0].size < (int)sVar74) {
            puVar82 = (uchar *)0x0;
            lVar115 = 0;
          }
          *(uchar **)((long)local_4d8 + lVar108 * 0x110 + 0x90) = puVar82;
          *(long *)((long)local_4d8 + lVar108 * 0x110 + 0x98) = lVar115;
          iVar93 = local_238[0].size;
        }
        if (((int)uVar168 < 0) || (iVar93 < (int)uVar168)) goto LAB_0015ab42;
        local_238[0].cursor = uVar168;
        sVar203 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4d8 + lVar108 * 0x110 + 0x50) = sVar203;
      }
      else if (sVar68 == 0) goto LAB_00157cd3;
      sVar74 = stbtt__find_table(pbVar113,local_488._0_4_,"maxp");
      if (sVar74 == 0) {
        uVar75 = 0xffff;
      }
      else {
        uVar75 = (uint)(ushort)(*(ushort *)(pbVar113 + (ulong)sVar74 + 4) << 8 |
                               *(ushort *)(pbVar113 + (ulong)sVar74 + 4) >> 8);
      }
      *(uint *)((long)local_4d8 + lVar108 * 0x110 + 0x14) = uVar75;
      uVar64 = *(ushort *)(pbVar113 + (ulong)sVar67 + 2) << 8 |
               *(ushort *)(pbVar113 + (ulong)sVar67 + 2) >> 8;
      *(undefined4 *)((long)local_4d8 + lVar108 * 0x110 + 0x34) = 0;
      if (uVar64 == 0) goto LAB_00157cd3;
      uVar75 = sVar67 + 4;
      uVar78 = (ulong)uVar64;
      iVar93 = 0;
      do {
        uVar64 = *(ushort *)(pbVar113 + uVar75) << 8 | *(ushort *)(pbVar113 + uVar75) >> 8;
        if ((uVar64 == 0) ||
           ((uVar64 == 3 &&
            ((uVar64 = *(ushort *)(pbVar113 + (ulong)uVar75 + 2) << 8 |
                       *(ushort *)(pbVar113 + (ulong)uVar75 + 2) >> 8, uVar64 == 10 || (uVar64 == 1)
             ))))) {
          uVar114 = *(uint *)(pbVar113 + (ulong)uVar75 + 4);
          iVar93 = (uVar114 >> 0x18 | (uVar114 & 0xff0000) >> 8 | (uVar114 & 0xff00) << 8 |
                   uVar114 << 0x18) + sVar67;
          *(int *)((long)local_4d8 + lVar108 * 0x110 + 0x34) = iVar93;
        }
        uVar75 = uVar75 + 8;
        uVar78 = uVar78 - 1;
      } while (uVar78 != 0);
      if (iVar93 == 0) goto LAB_00157cd3;
      *(uint *)((long)local_4d8 + lVar108 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (pbVar113 +
                           (long)*(int *)((long)local_4d8 + lVar108 * 0x110 + 0x1c) + 0x32) << 8 |
                         *(ushort *)
                          (pbVar113 +
                          (long)*(int *)((long)local_4d8 + lVar108 * 0x110 + 0x1c) + 0x32) >> 8);
      iVar93 = *(int *)((long)local_4d8 + lVar108 * 0x110 + 0xe0);
      if (((long)iVar93 < 0) || ((int)uVar110 <= iVar93)) goto LAB_0015aab6;
      pIVar92 = local_450->GlyphRanges;
      if (pIVar92 == (ImWchar *)0x0) {
        pIVar92 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4d8 + lVar108 * 0x110 + 0xd8) = pIVar92;
      IVar6 = *pIVar92;
      while (IVar6 != 0) {
        uVar64 = pIVar92[1];
        if (uVar64 == 0) break;
        uVar75 = *(uint *)((long)local_4d8 + lVar108 * 0x110 + 0xe4);
        uVar114 = (uint)uVar64;
        if ((int)(uint)uVar64 < (int)uVar75) {
          uVar114 = uVar75;
        }
        *(uint *)((long)local_4d8 + lVar108 * 0x110 + 0xe4) = uVar114;
        IVar6 = pIVar92[2];
        pIVar92 = pIVar92 + 2;
      }
      piVar79 = (int *)((long)iVar93 * 0x20 + local_498._0_8_);
      *piVar79 = *piVar79 + 1;
      iVar93 = *(int *)((long)local_4d8 + lVar108 * 0x110 + 0xe4);
      if (iVar93 < piVar79[1]) {
        iVar93 = piVar79[1];
      }
      piVar79[1] = iVar93;
      lVar108 = lVar108 + 1;
    } while (lVar108 < (local_478->ConfigData).Size);
  }
  auVar83 = (undefined1  [8])0;
  if (0 < (int)uVar8) {
    lVar108 = 0;
    auVar83 = (undefined1  [8])0;
    do {
      lVar115 = lVar108 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar115 + 0xe0);
      if (((long)iVar76 < 0) || ((int)uVar110 <= iVar76)) goto LAB_0015aab6;
      local_488 = auVar83;
      this_00 = (ImBitVector *)((long)local_4d8 + lVar115 + 0xf0);
      ImBitVector::Create(this_00,*(int *)((long)local_4d8 + lVar115 + 0xe4) + 1);
      lVar97 = (long)iVar76 * 0x20 + local_498._0_8_;
      this = (ImBitVector *)(lVar97 + 0x10);
      if (*(int *)(lVar97 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)(lVar97 + 4) + 1);
      }
      puVar102 = *(ushort **)((long)local_4d8 + lVar115 + 0xd8);
      uVar64 = *puVar102;
      for (; (uVar64 != 0 && (puVar102[1] != 0)); puVar102 = puVar102 + 2) {
        if (uVar64 <= puVar102[1]) {
          uVar75 = (uint)uVar64;
          do {
            bVar63 = ImBitVector::TestBit(this,uVar75);
            if ((!bVar63) &&
               (iVar76 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)local_4d8 + lVar115 + 8),
                                    *(int *)((long)local_4d8 + lVar115 + 0x34)), iVar76 != 0)) {
              piVar79 = (int *)((long)local_4d8 + lVar115 + 0xe8);
              *piVar79 = *piVar79 + 1;
              *(int *)(lVar97 + 8) = *(int *)(lVar97 + 8) + 1;
              ImBitVector::SetBit(this_00,uVar75);
              ImBitVector::SetBit(this,uVar75);
              auVar129 = _local_488;
              iVar76 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar76 + 1;
              _fStack_480 = auVar129._8_8_;
            }
            bVar63 = uVar75 < puVar102[1];
            uVar75 = uVar75 + 1;
          } while (bVar63);
        }
        uVar64 = puVar102[2];
      }
      lVar108 = lVar108 + 1;
      auVar83 = local_488;
    } while (lVar108 != lVar91);
    if (0 < (int)uVar8) {
      lVar108 = 0;
      do {
        lVar115 = lVar108 * 0x110;
        iVar76 = *(int *)((long)local_4d8 + lVar115 + 0xe8);
        if (*(int *)((long)local_4d8 + lVar115 + 0x104) < iVar76) {
          pvVar80 = ImGui::MemAlloc((long)iVar76 << 2);
          pvVar81 = *(void **)((long)local_4d8 + lVar115 + 0x108);
          if (pvVar81 != (void *)0x0) {
            memcpy(pvVar80,pvVar81,(long)*(int *)((long)local_4d8 + lVar115 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)local_4d8 + lVar115 + 0x108));
          }
          *(void **)((long)local_4d8 + lVar115 + 0x108) = pvVar80;
          *(int *)((long)local_4d8 + lVar115 + 0x104) = iVar76;
        }
        lVar97 = (long)*(int *)((long)local_4d8 + lVar115 + 0xf0);
        ptr_00 = *(uint **)((long)local_4d8 + lVar115 + 0xf8);
        if (0 < lVar97) {
          puVar204 = ptr_00 + lVar97;
          iVar76 = 0;
          do {
            uVar75 = *ptr_00;
            if (uVar75 != 0) {
              uVar114 = 0;
              do {
                if ((uVar75 >> (uVar114 & 0x1f) & 1) != 0) {
                  iVar93 = *(int *)((long)local_4d8 + lVar115 + 0x100);
                  if (iVar93 == *(int *)((long)local_4d8 + lVar115 + 0x104)) {
                    if (iVar93 == 0) {
                      iVar77 = 8;
                    }
                    else {
                      iVar77 = iVar93 / 2 + iVar93;
                    }
                    iVar156 = iVar93 + 1;
                    if (iVar93 + 1 < iVar77) {
                      iVar156 = iVar77;
                    }
                    pvVar81 = ImGui::MemAlloc((long)iVar156 << 2);
                    pvVar80 = *(void **)((long)local_4d8 + lVar115 + 0x108);
                    if (pvVar80 != (void *)0x0) {
                      memcpy(pvVar81,pvVar80,(long)*(int *)((long)local_4d8 + lVar115 + 0x100) << 2)
                      ;
                      ImGui::MemFree(*(void **)((long)local_4d8 + lVar115 + 0x108));
                    }
                    *(void **)((long)local_4d8 + lVar115 + 0x108) = pvVar81;
                    *(int *)((long)local_4d8 + lVar115 + 0x104) = iVar156;
                    iVar93 = *(int *)((long)local_4d8 + lVar115 + 0x100);
                  }
                  else {
                    pvVar81 = *(void **)((long)local_4d8 + lVar115 + 0x108);
                  }
                  *(uint *)((long)pvVar81 + (long)iVar93 * 4) = iVar76 + uVar114;
                  piVar79 = (int *)((long)local_4d8 + lVar115 + 0x100);
                  *piVar79 = *piVar79 + 1;
                }
                uVar114 = uVar114 + 1;
              } while (uVar114 != 0x20);
            }
            ptr_00 = ptr_00 + 1;
            iVar76 = iVar76 + 0x20;
          } while (ptr_00 < puVar204);
          ptr_00 = *(uint **)((long)local_4d8 + lVar115 + 0xf8);
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)local_4d8 + lVar115 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)local_4d8 + lVar115 + 0xf8) = 0;
        }
        if (*(int *)((long)local_4d8 + lVar115 + 0x100) !=
            *(int *)((long)local_4d8 + lVar115 + 0xe8)) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                        ,0x97e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar108 = lVar108 + 1;
      } while (lVar108 != lVar91);
      auVar83 = local_488;
    }
  }
  atlas_00 = local_478;
  uVar170 = local_498._0_8_;
  if ((int)uVar110 < 1) {
    if (local_498._0_8_ != 0) goto LAB_00157d47;
  }
  else {
    lVar108 = 0;
    do {
      pvVar81 = *(void **)(uVar170 + 0x18 + lVar108);
      if (pvVar81 != (void *)0x0) {
        *(undefined8 *)(uVar170 + 0x10 + lVar108) = 0;
        ImGui::MemFree(pvVar81);
        *(undefined8 *)(uVar170 + 0x18 + lVar108) = 0;
      }
      lVar108 = lVar108 + 0x20;
    } while (local_3e8._0_8_ != lVar108);
LAB_00157d47:
    ImGui::MemFree((void *)local_498._0_8_);
  }
  _local_3f8 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar110 = SUB84(auVar83,0);
  if ((int)uVar110 < 1) {
    local_3f8._0_4_ = uVar110;
    pvVar81 = (void *)0x0;
  }
  else {
    uVar78 = 8;
    if (8 < uVar110) {
      uVar78 = (ulong)auVar83 & 0xffffffff;
    }
    pvVar81 = ImGui::MemAlloc(uVar78 << 4);
    pvStack_3f0 = pvVar81;
    local_3f8._4_4_ = (int)uVar78;
    uVar78 = 8;
    if (8 < uVar110) {
      uVar78 = (ulong)auVar83 & 0xffffffff;
    }
    local_3f8._0_4_ = uVar110;
    pvStack_3a0 = ImGui::MemAlloc(uVar78 * 0x1c);
    local_3a8 = uVar78 << 0x20;
  }
  pvVar80 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar110);
  iVar76 = 0;
  memset(pvVar81,0,(long)(int)(uVar110 << 4));
  local_498._0_8_ = pvVar80;
  memset(pvVar80,0,(long)(int)(uVar110 * 0x1c));
  if ((int)uVar8 < 1) {
    fVar128 = 0.0;
  }
  else {
    lVar108 = 0;
    uVar78 = 0;
    uVar110 = 0;
    local_488 = auVar83;
    lVar115 = local_498._0_8_;
    do {
      iVar77 = (int)uVar78;
      iVar93 = *(int *)((long)local_4d8 + lVar108 * 0x110 + 0xe8);
      if (iVar93 != 0) {
        if ((iVar77 < 0) || (SUB84(auVar83,0) <= iVar77)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0015a97b;
        }
        psVar98 = (stbtt_fontinfo *)(lVar108 * 0x110 + (long)local_4d8);
        *(void **)&psVar98[1].hmtx = (void *)(uVar78 * 0x10 + (long)pvVar81);
        if (((int)uVar110 < 0) || (SUB84(auVar83,0) <= (int)uVar110)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0015a97b;
        }
        lVar97 = (ulong)uVar110 * 0x1c + lVar115;
        *(long *)&psVar98[1].gpos = lVar97;
        if ((atlas_00->ConfigData).Size <= lVar108) goto LAB_0015aa20;
        pIVar99 = (atlas_00->ConfigData).Data;
        fVar128 = pIVar99[lVar108].SizePixels;
        *(float *)&psVar98[1].userdata = fVar128;
        *(undefined4 *)((long)&psVar98[1].userdata + 4) = 0;
        psVar98[1].data = *(uchar **)&psVar98[1].gsubrs.cursor;
        uVar75 = *(uint *)&psVar98[1].gsubrs.data;
        uVar94 = (ulong)uVar75;
        psVar98[1].fontstart = uVar75;
        *(long *)&psVar98[1].loca = lVar97;
        *(char *)&psVar98[1].glyf = (char)pIVar99[lVar108].OversampleH;
        *(char *)((long)&psVar98[1].glyf + 1) = (char)pIVar99[lVar108].OversampleV;
        if (fVar128 <= 0.0) {
          fVar128 = -fVar128;
          uVar114 = (uint)(ushort)(*(ushort *)(psVar98->data + (long)psVar98->head + 0x12) << 8 |
                                  *(ushort *)(psVar98->data + (long)psVar98->head + 0x12) >> 8);
        }
        else {
          puVar82 = psVar98->data;
          lVar115 = (long)psVar98->hhea;
          uVar114 = ((int)(short)((ushort)puVar82[lVar115 + 4] << 8) | (uint)puVar82[lVar115 + 5]) -
                    ((int)(short)((ushort)puVar82[lVar115 + 6] << 8) | (uint)puVar82[lVar115 + 7]);
          lVar115 = local_498._0_8_;
        }
        fVar128 = fVar128 / (float)(int)uVar114;
        uVar78 = (ulong)(uint)(iVar77 + iVar93);
        uVar110 = uVar110 + iVar93;
        if (0 < (int)uVar75) {
          local_3e8._0_4_ = iVar77 + iVar93;
          uVar168 = (undefined4)lVar108;
          uVar187 = (undefined4)((ulong)lVar108 >> 0x20);
          iVar93 = atlas_00->TexGlyphPadding;
          lVar97 = 6;
          lVar115 = 0;
          do {
            if ((int)uVar94 <= lVar115) goto LAB_0015a966;
            iVar77 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar98->data,psVar98->index_map);
            if (iVar77 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                            ,0x9ad,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar98,iVar77,(float)pIVar99[lVar108].OversampleH * fVar128,
                       (float)pIVar99[lVar108].OversampleV * fVar128,fVar128,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_448,(int *)&local_410,(int *)&local_49c);
            uVar75 = (pIVar99[lVar108].OversampleH +
                     (((stbtt_uint32)local_410 + iVar93) - (int)local_238[0].data)) - 1;
            lVar95 = *(long *)&psVar98[1].hmtx;
            *(short *)(lVar95 + -2 + lVar97) = (short)uVar75;
            uVar114 = (pIVar99[lVar108].OversampleV + ((local_49c + iVar93) - local_448._0_4_)) - 1;
            *(short *)(lVar95 + lVar97) = (short)uVar114;
            iVar76 = iVar76 + (uVar114 & 0xffff) * (uVar75 & 0xffff);
            lVar115 = lVar115 + 1;
            uVar94 = (ulong)*(int *)&psVar98[1].gsubrs.data;
            lVar97 = lVar97 + 0x10;
          } while (lVar115 < (long)uVar94);
          lVar108 = CONCAT44(uVar187,uVar168);
          uVar78 = (ulong)(uint)local_3e8._0_4_;
          lVar115 = local_498._0_8_;
          atlas_00 = local_478;
          auVar83 = local_488;
        }
      }
      lVar108 = lVar108 + 1;
    } while (lVar108 != lVar91);
    fVar128 = (float)iVar76;
  }
  atlas_00->TexHeight = 0;
  fVar101 = (float)atlas_00->TexDesiredWidth;
  if ((int)fVar101 < 1) {
    iVar76 = (int)SQRT(fVar128);
    fVar101 = 5.73972e-42;
    if ((iVar76 < 0xb33) && (fVar101 = 2.86986e-42, iVar76 < 0x599)) {
      fVar101 = (float)((uint)(0x2cb < iVar76) * 0x200 + 0x200);
    }
  }
  atlas_00->TexWidth = (int)fVar101;
  uVar110 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar75 = (int)fVar101 - uVar110;
  local_440 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar75 << 4);
  auVar200 = _DAT_001b15c0;
  auVar129 = _DAT_001a7100;
  if ((ptr == (stbrp_context *)0x0) || (local_440 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_440 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_440);
    }
    local_440 = (stbrp_node *)0x0;
    uVar110 = 0;
    fVar101 = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar110 < -0x7fff) || (0xffff < (int)uVar75)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar78 = (ulong)(uVar75 - 1);
    if ((int)uVar75 < 2) {
      uVar78 = 0;
    }
    else {
      uVar94 = (ulong)(uVar75 & 0x7ffffffe);
      lVar108 = uVar78 - 1;
      auVar117._8_4_ = (int)lVar108;
      auVar117._0_8_ = lVar108;
      auVar117._12_4_ = (int)((ulong)lVar108 >> 0x20);
      ppsVar106 = &local_440[1].next;
      auVar117 = auVar117 ^ _DAT_001a7100;
      auVar142._8_4_ = 0xffffffff;
      auVar142._0_8_ = 0xffffffffffffffff;
      auVar142._12_4_ = 0xffffffff;
      auVar131 = _DAT_001b15b0;
      do {
        auVar147 = auVar131 ^ auVar129;
        auVar158._0_4_ = -(uint)(auVar117._0_4_ < auVar147._0_4_);
        auVar158._4_4_ = -(uint)(auVar117._4_4_ < auVar147._4_4_);
        auVar158._8_4_ = -(uint)(auVar117._8_4_ < auVar147._8_4_);
        auVar158._12_4_ = -(uint)(auVar117._12_4_ < auVar147._12_4_);
        auVar148._4_4_ = -(uint)(auVar147._4_4_ == auVar117._4_4_);
        auVar148._12_4_ = -(uint)(auVar147._12_4_ == auVar117._12_4_);
        auVar148._0_4_ = auVar148._4_4_;
        auVar148._8_4_ = auVar148._12_4_;
        auVar147._4_4_ = auVar158._4_4_;
        auVar147._0_4_ = auVar158._4_4_;
        auVar147._8_4_ = auVar158._12_4_;
        auVar147._12_4_ = auVar158._12_4_;
        auVar147 = auVar147 | auVar148 & auVar158;
        lVar108 = auVar131._8_8_;
        if ((~auVar147._0_4_ & 1) != 0) {
          ppsVar106[-2] = local_440 + auVar131._0_8_ + 1;
        }
        if (((auVar147 ^ auVar142) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar106 = local_440 + (lVar108 - auVar142._8_8_);
        }
        auVar131._0_8_ = auVar131._0_8_ + auVar200._0_8_;
        auVar131._8_8_ = lVar108 + auVar200._8_8_;
        ppsVar106 = ppsVar106 + 4;
        uVar94 = uVar94 - 2;
      } while (uVar94 != 0);
    }
    local_440[uVar78].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_440;
    ptr->active_head = ptr->extra;
    ptr->width = uVar75;
    ptr->height = 0x8000 - uVar110;
    ptr->num_nodes = uVar75;
    ptr->align = (int)((uVar75 - 1) + uVar75) / (int)uVar75;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar75;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_330 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if (0 < (int)uVar8) {
    lVar108 = 0;
    do {
      lVar115 = lVar108 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar115 + 0xe8);
      if (iVar76 != 0) {
        stbrp_pack_rects(local_330,*(stbrp_rect **)((long)local_4d8 + lVar115 + 200),iVar76);
        lVar97 = (long)*(int *)((long)local_4d8 + lVar115 + 0xe8);
        if (0 < lVar97) {
          lVar115 = *(long *)((long)local_4d8 + lVar115 + 200);
          lVar95 = 0;
          do {
            if (*(int *)(lVar115 + 0xc + lVar95) != 0) {
              iVar76 = (uint)*(ushort *)(lVar115 + 6 + lVar95) +
                       (uint)*(ushort *)(lVar115 + 10 + lVar95);
              if (iVar76 < atlas_00->TexHeight) {
                iVar76 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar76;
            }
            lVar95 = lVar95 + 0x10;
          } while (lVar97 * 0x10 != lVar95);
        }
      }
      lVar108 = lVar108 + 1;
    } while (lVar108 != lVar91);
  }
  uVar75 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar75 = (int)(uVar75 - 1) >> 1 | uVar75 - 1;
    uVar75 = (int)uVar75 >> 2 | uVar75;
    uVar75 = (int)uVar75 >> 4 | uVar75;
    uVar75 = (int)uVar75 >> 8 | uVar75;
    uVar75 = (int)uVar75 >> 0x10 | uVar75;
  }
  iVar76 = uVar75 + 1;
  atlas_00->TexHeight = iVar76;
  auVar129._0_4_ = (float)atlas_00->TexWidth;
  auVar129._4_4_ = (float)iVar76;
  auVar129._8_8_ = 0;
  auVar129 = divps(_DAT_001a7120,auVar129);
  atlas_00->TexUvScale = auVar129._0_8_;
  puVar82 = (uchar *)ImGui::MemAlloc((long)(iVar76 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar82;
  local_42c = fVar101;
  memset(puVar82,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < (int)uVar8) {
    local_390 = atlas_00->TexPixelsAlpha8;
    lVar115 = (long)(int)local_42c;
    local_298 = pshuflw(ZEXT416(uVar110),ZEXT416(uVar110),0);
    lVar108 = 0;
    auVar129 = _DAT_001b1590;
    do {
      auVar200 = _local_488;
      local_3c0 = lVar108;
      if ((atlas_00->ConfigData).Size <= lVar108) goto LAB_0015aa20;
      if (*(int *)((long)local_4d8 + lVar108 * 0x110 + 0xe8) != 0) {
        psVar98 = (stbtt_fontinfo *)(lVar108 * 0x110 + (long)local_4d8);
        fVar128 = *(float *)&psVar98[1].userdata;
        auVar149 = ZEXT416((uint)fVar128);
        if (fVar128 <= 0.0) {
          auVar149._0_4_ = -fVar128;
          auVar149._4_4_ = 0x80000000;
          auVar149._8_4_ = 0x80000000;
          auVar149._12_4_ = 0x80000000;
          uVar110 = (uint)(ushort)(*(ushort *)(psVar98->data + (long)psVar98->head + 0x12) << 8 |
                                  *(ushort *)(psVar98->data + (long)psVar98->head + 0x12) >> 8);
        }
        else {
          puVar82 = psVar98->data;
          lVar108 = (long)psVar98->hhea;
          uVar110 = ((int)(short)((ushort)puVar82[lVar108 + 4] << 8) | (uint)puVar82[lVar108 + 5]) -
                    ((int)(short)((ushort)puVar82[lVar108 + 6] << 8) | (uint)puVar82[lVar108 + 7]);
        }
        auVar150._4_12_ = auVar149._4_12_;
        auVar150._0_4_ = auVar149._0_4_ / (float)(int)uVar110;
        local_308 = (atlas_00->ConfigData).Data;
        iVar76 = psVar98[1].fontstart;
        if (0 < iVar76) {
          lVar108._0_4_ = psVar98[1].hmtx;
          lVar108._4_4_ = psVar98[1].kern;
          uVar78._0_4_ = psVar98[1].glyf;
          uVar78._4_4_ = psVar98[1].hhea;
          auVar37._8_6_ = 0;
          auVar37._0_8_ = uVar78;
          auVar37[0xe] = (char)((uint)uVar78._4_4_ >> 0x18);
          auVar39._8_4_ = 0;
          auVar39._0_8_ = uVar78;
          auVar39[0xc] = (char)((uint)uVar78._4_4_ >> 0x10);
          auVar39._13_2_ = auVar37._13_2_;
          auVar40._8_4_ = 0;
          auVar40._0_8_ = uVar78;
          auVar40._12_3_ = auVar39._12_3_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = uVar78;
          auVar41[10] = (char)((uint)uVar78._4_4_ >> 8);
          auVar41._11_4_ = auVar40._11_4_;
          auVar44._8_2_ = 0;
          auVar44._0_8_ = uVar78;
          auVar44._10_5_ = auVar41._10_5_;
          auVar45[8] = (char)uVar78._4_4_;
          auVar45._0_8_ = uVar78;
          auVar45._9_6_ = auVar44._9_6_;
          auVar48._7_8_ = 0;
          auVar48._0_7_ = auVar45._8_7_;
          cVar126 = (char)((uint)(undefined4)uVar78 >> 0x18);
          Var49 = CONCAT81(SUB158(auVar48 << 0x40,7),cVar126);
          auVar55._9_6_ = 0;
          auVar55._0_9_ = Var49;
          cVar124 = (char)((uint)(undefined4)uVar78 >> 0x10);
          auVar46[4] = cVar124;
          auVar46._0_4_ = (undefined4)uVar78;
          auVar46._5_10_ = SUB1510(auVar55 << 0x30,5);
          auVar50._11_4_ = 0;
          auVar50._0_11_ = auVar46._4_11_;
          cVar123 = (char)((uint)(undefined4)uVar78 >> 8);
          auVar51._1_12_ = SUB1512(auVar50 << 0x20,3);
          auVar51[0] = cVar123;
          bVar116 = (byte)(undefined4)uVar78;
          uVar64 = CONCAT11(0,bVar116);
          auVar47._2_13_ = auVar51;
          auVar47._0_2_ = uVar64;
          uVar125 = auVar51._0_2_;
          sVar88 = -auVar46._4_2_;
          sVar127 = (short)Var49;
          sVar66 = -sVar127;
          local_470 = (ulong)uVar125;
          auVar38._10_2_ = 0;
          auVar38._0_10_ = auVar47._0_10_;
          auVar38._12_2_ = sVar127;
          uVar57 = CONCAT42(auVar38._10_4_,auVar46._4_2_);
          auVar52._6_8_ = 0;
          auVar52._0_6_ = uVar57;
          auVar42._4_2_ = uVar125;
          auVar42._0_4_ = auVar47._0_4_;
          auVar42._6_8_ = SUB148(auVar52 << 0x40,6);
          auVar118._0_4_ = (float)uVar64;
          auVar118._4_4_ = (float)auVar42._4_4_;
          auVar118._8_4_ = (float)(int)uVar57;
          auVar118._12_4_ = (float)(auVar38._10_4_ >> 0x10);
          local_268 = divps(_DAT_001a7120,auVar118);
          auVar159[0] = -(bVar116 == 0);
          auVar159[1] = -(bVar116 == 0);
          auVar159[2] = -(bVar116 == 0);
          auVar159[3] = -(bVar116 == 0);
          auVar159[4] = -(cVar123 == '\0');
          auVar159[5] = -(cVar123 == '\0');
          auVar159[6] = -(cVar123 == '\0');
          auVar159[7] = -(cVar123 == '\0');
          auVar159[8] = -(cVar124 == '\0');
          auVar159[9] = -(cVar124 == '\0');
          auVar159[10] = -(cVar124 == '\0');
          auVar159[0xb] = -(cVar124 == '\0');
          auVar159[0xc] = -(cVar126 == '\0');
          auVar159[0xd] = -(cVar126 == '\0');
          auVar159[0xe] = -(cVar126 == '\0');
          auVar159[0xf] = -(cVar126 == '\0');
          Var56 = CONCAT64(CONCAT42(CONCAT22(sVar66,sVar66),sVar88),CONCAT22(sVar88,sVar66));
          auVar53._4_8_ = (long)((unkuint10)Var56 >> 0x10);
          auVar53._2_2_ = 1 - uVar125;
          auVar53._0_2_ = 1 - uVar125;
          auVar130._0_4_ = (float)(int)(short)(1 - uVar64);
          auVar130._4_4_ = (float)(auVar53._0_4_ >> 0x10);
          auVar130._8_4_ = (float)((int)((unkuint10)Var56 >> 0x10) >> 0x10);
          auVar130._12_4_ = (float)(int)sVar66;
          auVar143._0_4_ = auVar150._0_4_ * auVar118._0_4_;
          auVar143._4_4_ = auVar150._0_4_ * auVar118._4_4_;
          auVar143._8_4_ = auVar150._0_4_ * auVar118._8_4_;
          auVar143._12_4_ = auVar150._0_4_ * auVar118._12_4_;
          auVar119._0_4_ = auVar118._0_4_ + auVar118._0_4_;
          auVar119._4_4_ = auVar118._4_4_ + auVar118._4_4_;
          auVar119._8_4_ = auVar118._8_4_ + auVar118._8_4_;
          auVar119._12_4_ = auVar118._12_4_ + auVar118._12_4_;
          auVar131 = divps(auVar130,auVar119);
          fVar128 = auVar143._4_4_;
          if (auVar143._0_4_ <= auVar143._4_4_) {
            fVar128 = auVar143._0_4_;
          }
          local_3c4 = (0.35 / fVar128) * (0.35 / fVar128);
          local_2b8 = auVar143._4_4_;
          fStack_2b4 = auVar143._4_4_;
          fStack_2b0 = auVar143._4_4_;
          fStack_2ac = auVar143._4_4_;
          local_318 = (ulong)((undefined4)uVar78 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar78 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar159 & auVar131;
          local_288._4_4_ = SUB164(~auVar159 & auVar131,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_488._4_4_ = 0;
          local_488._0_4_ = auVar47._0_4_ & 0xff;
          _fStack_480 = auVar200._8_8_;
          local_2a8 = auVar143;
          uVar78 = CONCAT44(auVar143._4_4_,auVar143._0_4_);
          local_248 = uVar78 ^ 0x8000000000000000;
          fStack_240 = auVar143._0_4_;
          fStack_23c = -auVar143._4_4_;
          lVar97 = 0;
          local_3b8 = psVar98;
          local_2e0 = lVar108;
          local_468 = auVar150;
          do {
            if (((*(int *)(lVar108 + 0xc + lVar97 * 0x10) != 0) &&
                (lVar95 = lVar97 * 0x10 + lVar108, *(short *)(lVar95 + 4) != 0)) &&
               (*(short *)(lVar95 + 6) != 0)) {
              local_2d8 = (short *)(lVar97 * 0x1c + *(long *)&psVar98[1].loca);
              local_2d0 = lVar97;
              iVar93 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar98->data,psVar98->index_map);
              uVar170 = *(undefined8 *)(lVar95 + 4);
              *(ulong *)(lVar95 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar170 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar170 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar170 >> 0x10) - local_298._2_2_,
                                     (short)uVar170 - local_298._0_2_));
              puVar82 = psVar98->data;
              uVar64 = *(ushort *)(puVar82 + (long)psVar98->hhea + 0x22) << 8 |
                       *(ushort *)(puVar82 + (long)psVar98->hhea + 0x22) >> 8;
              iVar76 = psVar98->hmtx;
              lVar108 = (ulong)uVar64 * 4 + (long)iVar76 + -4;
              lVar97 = (ulong)uVar64 * 4 + (long)iVar76 + -3;
              if (iVar93 < (int)(uint)uVar64) {
                lVar108 = (long)(iVar93 * 4) + (long)iVar76;
                lVar97 = (long)(iVar93 * 4) + 1 + (long)iVar76;
              }
              local_364 = (uint)puVar82[lVar97];
              local_360 = (uint)puVar82[lVar108];
              auVar129 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar98,iVar93,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar143._0_4_,&local_350,&local_354,&local_2bc,&local_2c0);
              fVar128 = auVar129._0_4_;
              uVar64 = *(ushort *)(lVar95 + 8);
              uVar125 = *(ushort *)(lVar95 + 10);
              local_428 = (ulong)*(ushort *)(lVar95 + 4);
              local_3d0 = (ulong)*(ushort *)(lVar95 + 6);
              local_378 = lVar95;
              uVar110 = stbtt_GetGlyphShape(psVar98,iVar93,(stbtt_vertex **)&local_410);
              uVar75 = ((int)local_428 - local_488._0_4_) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3b8,iVar93,(float)local_2a8._0_4_,local_2b8,fVar128,auVar143._0_4_,
                         (int *)&local_49c,&local_34c,(int *)0x0,(int *)0x0);
              local_3fc = uVar75;
              if (uVar75 != 0) {
                iVar76 = ((int)local_3d0 - (int)local_470) + 1;
                if ((iVar76 != 0) && (0 < (int)uVar110)) {
                  local_2e8 = local_390 + (ulong)uVar125 * lVar115 + (ulong)uVar64;
                  local_428 = (ulong)(uint)((int)local_428 - local_488._0_4_);
                  local_3d0 = (ulong)(uint)((int)local_3d0 - (int)local_470);
                  lVar108 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                  local_498._0_4_ = local_49c;
                  local_404 = local_34c;
                  lVar97 = 0;
                  uVar75 = 0;
                  do {
                    uVar75 = uVar75 + (*(char *)(lVar108 + 0xc + lVar97) == '\x01');
                    lVar97 = lVar97 + 0xe;
                  } while ((ulong)uVar110 * 0xe != lVar97);
                  if ((uVar75 != 0) &&
                     (local_420 = ImGui::MemAlloc((ulong)uVar75 * 4), local_420 != (void *)0x0)) {
                    uVar168 = 0;
                    bVar87 = false;
                    iVar77 = 0;
                    local_450 = (ImFontConfig *)0x0;
                    iVar93 = 0;
                    bVar63 = true;
                    do {
                      bVar96 = bVar63;
                      if ((bVar87) &&
                         (local_450 = (ImFontConfig *)ImGui::MemAlloc((long)iVar93 << 3),
                         local_450 == (ImFontConfig *)0x0)) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(local_420);
                        goto LAB_00159850;
                      }
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      fVar128 = 0.0;
                      fVar101 = 0.0;
                      uVar114 = 0xffffffff;
                      lVar97 = 0;
                      do {
                        iVar93 = (int)local_238[0].data;
                        switch(*(undefined1 *)(lVar108 + 0xc + lVar97)) {
                        case 1:
                          if (-1 < (int)uVar114) {
                            *(int *)((long)local_420 + (ulong)uVar114 * 4) =
                                 (int)local_238[0].data - iVar77;
                          }
                          uVar114 = uVar114 + 1;
                          auVar129 = pshuflw(ZEXT416(*(uint *)(lVar108 + lVar97)),
                                             ZEXT416(*(uint *)(lVar108 + lVar97)),0x60);
                          fVar128 = (float)(auVar129._0_4_ >> 0x10);
                          fVar101 = (float)(auVar129._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          iVar77 = iVar93;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + (long)iVar93 * 8 + -0x56) = fVar128;
                            *(float *)(local_450->Name + (long)iVar93 * 8 + -0x56 + 4) = fVar101;
                          }
                          break;
                        case 2:
                          lVar95 = (long)(int)local_238[0].data;
                          auVar129 = pshuflw(ZEXT416(*(uint *)(lVar108 + lVar97)),
                                             ZEXT416(*(uint *)(lVar108 + lVar97)),0x60);
                          fVar128 = (float)(auVar129._0_4_ >> 0x10);
                          fVar101 = (float)(auVar129._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + lVar95 * 8 + -0x56) = fVar128;
                            *(float *)(local_450->Name + lVar95 * 8 + -0x56 + 4) = fVar101;
                          }
                          break;
                        case 3:
                          fVar153 = (float)(int)*(short *)(lVar108 + 6 + lVar97);
                          auVar143 = ZEXT416((uint)fVar153);
                          stbtt__tesselate_curve
                                    ((stbtt__point *)local_450,(int *)local_238,fVar128,fVar101,
                                     (float)(int)*(short *)(lVar108 + 4 + lVar97),fVar153,
                                     (float)(int)*(short *)(lVar108 + lVar97),
                                     (float)(int)*(short *)(lVar108 + 2 + lVar97),local_3c4,0);
                          goto LAB_00158b0d;
                        case 4:
                          fVar153 = (float)(int)*(short *)(lVar108 + 6 + lVar97);
                          auVar143 = ZEXT416((uint)fVar153);
                          stbtt__tesselate_cubic
                                    ((stbtt__point *)local_450,(int *)local_238,fVar128,fVar101,
                                     (float)(int)*(short *)(lVar108 + 4 + lVar97),fVar153,
                                     (float)(int)*(short *)(lVar108 + 8 + lVar97),
                                     (float)(int)*(short *)(lVar108 + 10 + lVar97),
                                     (float)(int)*(short *)(lVar108 + lVar97),
                                     (float)(int)*(short *)(lVar108 + 2 + lVar97),local_3c4,0);
LAB_00158b0d:
                          auVar129 = pshuflw(ZEXT416(*(uint *)(lVar108 + lVar97)),
                                             ZEXT416(*(uint *)(lVar108 + lVar97)),0x60);
                          fVar128 = (float)(auVar129._0_4_ >> 0x10);
                          fVar101 = (float)(auVar129._4_4_ >> 0x10);
                        }
                        pIVar99 = local_450;
                        lVar97 = lVar97 + 0xe;
                      } while ((ulong)uVar110 * 0xe != lVar97);
                      *(int *)((long)local_420 + (long)(int)uVar114 * 4) =
                           (int)local_238[0].data - iVar77;
                      bVar87 = true;
                      iVar93 = (int)local_238[0].data;
                      bVar63 = false;
                    } while (bVar96);
                    if (local_450 != (ImFontConfig *)0x0) {
                      lVar108 = 0;
                      lVar97 = 0;
                      do {
                        lVar97 = (long)(int)lVar97 + (long)*(int *)((long)local_420 + lVar108 * 4);
                        lVar108 = lVar108 + 1;
                      } while (CONCAT44(uVar168,uVar75) != lVar108);
                      local_438 = (stbtt__edge *)ImGui::MemAlloc(lVar97 * 0x14 + 0x14);
                      if (local_438 != (stbtt__edge *)0x0) {
                        lVar108 = 0;
                        uVar110 = 0;
                        iVar93 = 0;
                        do {
                          iVar77 = *(int *)((long)local_420 + lVar108 * 4);
                          if (0 < iVar77) {
                            lVar97 = (long)iVar93;
                            uVar94 = (ulong)(iVar77 - 1);
                            uVar78 = 0;
                            iVar156 = iVar77;
                            do {
                              iVar111 = (int)uVar94;
                              fVar128 = *(float *)(local_450->Name +
                                                  (long)iVar111 * 8 + lVar97 * 8 + -0x52);
                              fVar101 = *(float *)(pIVar99->Name + uVar78 * 8 + lVar97 * 8 + -0x52);
                              if ((fVar128 != fVar101) || (NAN(fVar128) || NAN(fVar101))) {
                                iVar112 = (int)uVar78;
                                iVar156 = iVar111;
                                if (fVar128 <= fVar101) {
                                  iVar156 = iVar112;
                                  iVar112 = iVar111;
                                }
                                local_438[(int)uVar110].invert = (uint)(fVar101 < fVar128);
                                uVar170 = *(undefined8 *)
                                           (local_450->Name + (long)iVar156 * 8 + lVar97 * 8 + -0x56
                                           );
                                uVar189 = *(undefined8 *)
                                           (local_450->Name + (long)iVar112 * 8 + lVar97 * 8 + -0x56
                                           );
                                psVar103 = local_438 + (int)uVar110;
                                psVar103->x0 = (float)uVar170 * (float)local_248._0_4_ + 0.0;
                                psVar103->y0 = (float)((ulong)uVar170 >> 0x20) *
                                               (float)local_248._4_4_ + 0.0;
                                psVar103->x1 = (float)uVar189 * fStack_240 + 0.0;
                                psVar103->y1 = (float)((ulong)uVar189 >> 0x20) * fStack_23c + 0.0;
                                uVar110 = uVar110 + 1;
                                iVar156 = *(int *)((long)local_420 + lVar108 * 4);
                              }
                              uVar94 = uVar78 & 0xffffffff;
                              uVar78 = uVar78 + 1;
                            } while ((long)uVar78 < (long)iVar156);
                          }
                          iVar93 = iVar93 + iVar77;
                          lVar108 = lVar108 + 1;
                        } while (lVar108 != CONCAT44(uVar168,uVar75));
                        stbtt__sort_edges_quicksort(local_438,uVar110);
                        if (1 < (int)uVar110) {
                          uVar78 = 1;
                          lVar108 = 2;
                          psVar103 = local_438;
                          do {
                            uVar1 = local_438[uVar78].x0;
                            uVar2 = local_438[uVar78].y0;
                            iVar93 = local_438[uVar78].invert;
                            local_238[0].cursor = iVar93;
                            local_238[0].data = *(uchar **)&local_438[uVar78].x1;
                            lVar97 = lVar108;
                            psVar109 = psVar103;
                            do {
                              if (psVar109->y0 <= (float)uVar2) {
                                uVar75 = (int)lVar97 - 1;
                                goto LAB_00158d62;
                              }
                              psVar109[1].invert = psVar109->invert;
                              fVar128 = psVar109->y0;
                              fVar101 = psVar109->x1;
                              fVar153 = psVar109->y1;
                              psVar109[1].x0 = psVar109->x0;
                              psVar109[1].y0 = fVar128;
                              psVar109[1].x1 = fVar101;
                              psVar109[1].y1 = fVar153;
                              lVar97 = lVar97 + -1;
                              psVar109 = psVar109 + -1;
                            } while (1 < lVar97);
                            uVar75 = 0;
LAB_00158d62:
                            if (uVar78 != uVar75) {
                              local_438[(int)uVar75].x0 = (float)uVar1;
                              local_438[(int)uVar75].y0 = (float)uVar2;
                              *(uchar **)&local_438[(int)uVar75].x1 = local_238[0].data;
                              local_438[(int)uVar75].invert = iVar93;
                            }
                            uVar78 = uVar78 + 1;
                            lVar108 = lVar108 + 1;
                            psVar103 = psVar103 + 1;
                          } while (uVar78 != uVar110);
                        }
                        local_448 = (undefined1  [8])0x0;
                        scanline = local_238;
                        if (0x3f < (int)(uint)local_428) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        local_438[(int)uVar110].y0 = (float)(iVar76 + local_404) + 1.0;
                        if ((uint)local_3d0 < 0x7fffffff) {
                          local_300 = (long)(int)local_3fc;
                          local_35c = (float)(int)local_498._0_4_;
                          local_370 = (float *)((long)&scanline->data + local_300 * 4);
                          local_328 = local_370 + 1;
                          local_2f0 = local_300 * 4;
                          local_2f8 = (long)(int)(uint)local_428 * 4 + 8;
                          local_400 = (float)(int)local_3fc;
                          local_388 = 0;
                          local_380 = 0;
                          local_3b0 = (undefined8 *)0x0;
                          local_3c8 = 0;
                          local_418 = (stbtt__active_edge *)0x0;
                          auVar83 = (undefined1  [8])(stbtt__active_edge *)0x0;
                          psVar103 = local_438;
                          iVar76 = local_404;
                          do {
                            local_368 = iVar76;
                            iVar76 = local_404;
                            fVar128 = (float)local_368;
                            fVar101 = fVar128 + 1.0;
                            memset(scanline,0,local_2f0);
                            memset(local_370,0,local_2f8);
                            if (auVar83 != (undefined1  [8])0x0) {
                              psVar85 = (stbtt__active_edge *)local_448;
                              do {
                                if (((stbtt__active_edge *)auVar83)->ey <= fVar128) {
                                  psVar85->next = ((stbtt__active_edge *)auVar83)->next;
                                  if ((((stbtt__active_edge *)auVar83)->direction == 0.0) &&
                                     (!NAN(((stbtt__active_edge *)auVar83)->direction))) {
                                    __assert_fail("z->direction",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xc63,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  ((stbtt__active_edge *)auVar83)->direction = 0.0;
                                  ((stbtt__active_edge *)auVar83)->next = local_418;
                                  local_418 = (stbtt__active_edge *)auVar83;
                                  auVar83 = (undefined1  [8])psVar85;
                                }
                                ppsVar62 = &((stbtt__active_edge *)auVar83)->next;
                                psVar85 = (stbtt__active_edge *)auVar83;
                                auVar83 = (undefined1  [8])*ppsVar62;
                              } while (*ppsVar62 != (stbtt__active_edge *)0x0);
                            }
                            fVar153 = psVar103->y0;
                            if (fVar153 <= fVar101) {
                              bVar63 = (int)local_380 == 0;
                              do {
                                psVar85 = local_418;
                                fVar154 = psVar103->y1;
                                if ((fVar153 != fVar154) || (NAN(fVar153) || NAN(fVar154))) {
                                  if (local_418 == (stbtt__active_edge *)0x0) {
                                    if (local_3c8 == 0) {
                                      puVar84 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar84 == (undefined8 *)0x0) {
                                        __assert_fail("z != __null",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xad1,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                      }
                                      *puVar84 = local_3b0;
                                      fVar153 = psVar103->y0;
                                      fVar154 = psVar103->y1;
                                      local_3c8 = 799;
                                    }
                                    else {
                                      local_3c8 = local_3c8 + -1;
                                      puVar84 = local_3b0;
                                    }
                                    local_3b0 = puVar84;
                                    psVar85 = (stbtt__active_edge *)
                                              (puVar84 + (long)local_3c8 * 4 + 1);
                                    local_418 = (stbtt__active_edge *)0x0;
                                  }
                                  else {
                                    local_418 = local_418->next;
                                  }
                                  fVar155 = psVar103->x0;
                                  fVar157 = (psVar103->x1 - fVar155) / (fVar154 - fVar153);
                                  psVar85->fdx = fVar157;
                                  psVar85->fdy = (float)(-(uint)(fVar157 != 0.0) &
                                                        (uint)(1.0 / fVar157));
                                  psVar85->fx = ((fVar128 - fVar153) * fVar157 + fVar155) -
                                                local_35c;
                                  psVar85->direction =
                                       *(float *)(&DAT_001a7d78 + (ulong)(psVar103->invert == 0) * 4
                                                 );
                                  psVar85->sy = fVar153;
                                  psVar85->ey = fVar154;
                                  psVar85->next = (stbtt__active_edge *)0x0;
                                  if (fVar154 < fVar128 && (bVar63 && iVar76 != 0)) {
                                    psVar85->ey = fVar128;
                                    fVar154 = fVar128;
                                  }
                                  if (fVar154 < fVar128) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xc76,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar85->next = (stbtt__active_edge *)local_448;
                                  local_448 = (undefined1  [8])psVar85;
                                }
                                else {
                                }
                                fVar153 = psVar103[1].y0;
                                psVar103 = psVar103 + 1;
                              } while (fVar153 <= fVar101);
                            }
                            if (local_448 != (undefined1  [8])0x0) {
                              local_2c8 = psVar103;
                              auVar83 = local_448;
                              do {
                                fVar153 = ((stbtt__active_edge *)auVar83)->ey;
                                if (fVar153 < fVar128) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                ,0xba5,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar154 = ((stbtt__active_edge *)auVar83)->fx;
                                auVar200._0_8_ = CONCAT44(0,fVar154);
                                auVar200._8_8_ = 0;
                                fVar155 = ((stbtt__active_edge *)auVar83)->fdx;
                                if ((fVar155 != 0.0) || (NAN(fVar155))) {
                                  fVar157 = ((stbtt__active_edge *)auVar83)->sy;
                                  if (fVar101 < fVar157) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,3000,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar164 = fVar155 + fVar154;
                                  fVar162 = (float)(~-(uint)(fVar128 < fVar157) & (uint)fVar154 |
                                                   (uint)((fVar157 - fVar128) * fVar155 + fVar154) &
                                                   -(uint)(fVar128 < fVar157));
                                  if ((((fVar162 < 0.0) ||
                                       (fVar165 = (float)(~-(uint)(fVar153 < fVar101) &
                                                          (uint)fVar164 |
                                                         (uint)((fVar153 - fVar128) * fVar155 +
                                                               fVar154) & -(uint)(fVar153 < fVar101)
                                                         ), fVar165 < 0.0)) ||
                                      (local_400 <= fVar162)) || (local_400 <= fVar165)) {
                                    if ((uint)local_428 < 0x7fffffff) {
                                      local_3e8 = ZEXT416((uint)fVar164);
                                      local_358 = fVar155;
                                      local_348 = auVar200;
                                      uVar110 = 0;
                                      do {
                                        fVar155 = (float)(int)uVar110;
                                        uVar75 = uVar110 + 1;
                                        fVar153 = (float)(int)uVar75;
                                        fVar154 = local_348._0_4_;
                                        fVar157 = (fVar155 - fVar154) / local_358 + fVar128;
                                        fVar162 = (fVar153 - fVar154) / local_358 + fVar128;
                                        fVar164 = local_3e8._0_4_;
                                        if ((fVar155 <= fVar154) || (fVar164 <= fVar153)) {
                                          if ((fVar155 <= fVar164) || (fVar154 <= fVar153)) {
                                            fVar165 = fVar128;
                                            if (((fVar155 <= fVar154) || (fVar164 <= fVar155)) &&
                                               ((fVar155 <= fVar164 || (fVar154 <= fVar155)))) {
                                              if (((fVar154 < fVar153) && (fVar153 < fVar164)) ||
                                                 ((fVar155 = fVar154, fVar157 = fVar128,
                                                  fVar164 < fVar153 && (fVar153 < fVar154)))) {
                                                local_498._0_4_ = fVar153;
                                                fVar155 = fVar128;
                                                fVar157 = fVar162;
                                                goto LAB_001593b9;
                                              }
                                              goto LAB_0015946d;
                                            }
                                          }
                                          else {
                                            local_498._0_4_ = fVar153;
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar110,
                                                       (stbtt__active_edge *)auVar83,fVar154,fVar128
                                                       ,fVar153,fVar162);
                                            fVar154 = (float)local_498._0_4_;
                                            fVar165 = fVar162;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar110,
                                                     (stbtt__active_edge *)auVar83,fVar154,fVar165,
                                                     fVar155,fVar157);
                                        }
                                        else {
                                          local_498._0_4_ = fVar153;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar110,
                                                     (stbtt__active_edge *)auVar83,fVar154,fVar128,
                                                     fVar155,fVar157);
                                          fVar154 = fVar155;
                                          fVar153 = (float)local_498._0_4_;
                                          fVar155 = fVar157;
                                          fVar157 = fVar162;
LAB_001593b9:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar110,
                                                     (stbtt__active_edge *)auVar83,fVar154,fVar155,
                                                     fVar153,fVar157);
                                          fVar155 = (float)local_498._0_4_;
                                        }
LAB_0015946d:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar110,
                                                   (stbtt__active_edge *)auVar83,fVar155,fVar157,
                                                   local_3e8._0_4_,fVar101);
                                        uVar110 = uVar75;
                                      } while (local_3fc != uVar75);
                                    }
                                  }
                                  else {
                                    if (fVar157 <= fVar128) {
                                      fVar157 = fVar128;
                                    }
                                    uVar110 = (uint)fVar162;
                                    if (fVar101 <= fVar153) {
                                      fVar153 = fVar101;
                                    }
                                    uVar75 = (uint)fVar165;
                                    if (uVar110 == uVar75) {
                                      if (((int)uVar110 < 0) ||
                                         ((int)(uint)local_428 < (int)uVar110)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar78 = (ulong)uVar110;
                                      *(float *)((long)&scanline->data + uVar78 * 4) =
                                           (((fVar165 - (float)(int)uVar110) +
                                            (fVar162 - (float)(int)uVar110)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar83)->direction *
                                           (fVar153 - fVar157) +
                                           *(float *)((long)&scanline->data + uVar78 * 4);
                                      fVar154 = (fVar153 - fVar157) *
                                                ((stbtt__active_edge *)auVar83)->direction;
                                    }
                                    else {
                                      fVar155 = ((stbtt__active_edge *)auVar83)->fdy;
                                      uVar114 = uVar110;
                                      fVar167 = fVar162;
                                      if (fVar165 < fVar162) {
                                        fVar154 = fVar128 - fVar157;
                                        fVar157 = (fVar128 - fVar153) + fVar101;
                                        fVar155 = -fVar155;
                                        uVar114 = uVar75;
                                        uVar75 = uVar110;
                                        fVar153 = fVar154 + fVar101;
                                        fVar167 = fVar165;
                                        fVar165 = fVar162;
                                        fVar154 = fVar164;
                                      }
                                      iVar76 = uVar114 + 1;
                                      fVar164 = ((float)iVar76 - fVar154) * fVar155 + fVar128;
                                      fVar154 = ((stbtt__active_edge *)auVar83)->direction;
                                      fVar162 = (fVar164 - fVar157) * fVar154;
                                      lVar108 = (long)(int)uVar114;
                                      *(float *)((long)&scanline->data + lVar108 * 4) =
                                           (((fVar167 - (float)(int)uVar114) + 1.0) * -0.5 + 1.0) *
                                           fVar162 + *(float *)((long)&scanline->data + lVar108 * 4)
                                      ;
                                      if (uVar75 - iVar76 != 0 && iVar76 <= (int)uVar75) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar108 * 4 + 4) =
                                               fVar155 * fVar154 * 0.5 + fVar162 +
                                               *(float *)((long)&scanline->data + lVar108 * 4 + 4);
                                          fVar162 = fVar162 + fVar155 * fVar154;
                                          lVar108 = lVar108 + 1;
                                        } while (uVar75 - 1 != (int)lVar108);
                                      }
                                      if (1.01 < ABS(fVar162)) {
                                        __assert_fail("fabsf(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar78 = (ulong)(int)uVar75;
                                      *(float *)((long)&scanline->data + uVar78 * 4) =
                                           (fVar153 -
                                           (fVar155 * (float)(int)(uVar75 - iVar76) + fVar164)) *
                                           (((fVar165 - (float)(int)uVar75) + 0.0) * -0.5 + 1.0) *
                                           fVar154 + fVar162 +
                                           *(float *)((long)&scanline->data + uVar78 * 4);
                                      fVar154 = (fVar153 - fVar157) * fVar154;
                                    }
                                    local_328[uVar78] = fVar154 + local_328[uVar78];
                                  }
                                }
                                else if (fVar154 < local_400) {
                                  if (0.0 <= fVar154) {
                                    local_348 = auVar200;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar154,
                                               (stbtt__active_edge *)auVar83,fVar154,fVar128,fVar154
                                               ,fVar101);
                                    iVar76 = (int)fVar154 + 1;
                                    auVar136 = local_348;
                                  }
                                  else {
                                    iVar76 = 0;
                                    auVar136._8_8_ = 0;
                                    auVar136._0_8_ = auVar200._0_8_;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_370,iVar76,(stbtt__active_edge *)auVar83,
                                             auVar136._0_4_,fVar128,auVar136._0_4_,fVar101);
                                }
                                auVar83 = (undefined1  [8])((stbtt__active_edge *)auVar83)->next;
                                psVar103 = local_2c8;
                              } while (auVar83 != (undefined1  [8])0x0);
                            }
                            uVar110 = (uint)DAT_001a7140;
                            auVar143._0_12_ = ZEXT812(0x437f0000);
                            auVar143._12_4_ = 0.0;
                            auVar83 = local_448;
                            if ((uint)local_428 < 0x7fffffff) {
                              fVar128 = 0.0;
                              psVar86 = scanline;
                              uVar78 = local_388;
                              lVar108 = local_300;
                              do {
                                fVar128 = fVar128 + *(float *)((long)&psVar86->data + local_300 * 4)
                                ;
                                iVar76 = (int)((float)((uint)(*(float *)&psVar86->data + fVar128) &
                                                      uVar110) * 255.0 + 0.5);
                                if (0xfe < iVar76) {
                                  iVar76 = 0xff;
                                }
                                local_2e8[(int)uVar78] = (uchar)iVar76;
                                uVar78 = (ulong)((int)uVar78 + 1);
                                psVar86 = (stbtt__buf *)((long)&psVar86->data + 4);
                                lVar108 = lVar108 + -1;
                              } while (lVar108 != 0);
                            }
                            for (; auVar83 != (undefined1  [8])0x0;
                                auVar83 = (undefined1  [8])((stbtt__active_edge *)auVar83)->next) {
                              ((stbtt__active_edge *)auVar83)->fx =
                                   ((stbtt__active_edge *)auVar83)->fdx +
                                   ((stbtt__active_edge *)auVar83)->fx;
                            }
                            iVar93 = (int)local_380;
                            local_380 = (ulong)(iVar93 + 1);
                            local_388 = (ulong)(uint)((int)local_388 + (int)local_42c);
                            puVar84 = local_3b0;
                            auVar83 = local_448;
                            iVar76 = local_368 + 1;
                          } while (iVar93 != (uint)local_3d0);
                          while (puVar84 != (undefined8 *)0x0) {
                            puVar11 = (undefined8 *)*puVar84;
                            ImGui::MemFree(puVar84);
                            puVar84 = puVar11;
                          }
                        }
                        pIVar99 = local_450;
                        if (scanline != local_238) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(local_438);
                      }
                      ImGui::MemFree(local_420);
                      ImGui::MemFree(pIVar99);
                    }
                  }
                }
              }
LAB_00159850:
              ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
              uVar78 = (ulong)*(ushort *)(local_378 + 8);
              uVar64 = *(ushort *)(local_378 + 10);
              uVar125 = *(ushort *)(local_378 + 4);
              uVar110 = (uint)uVar125;
              uVar65 = *(ushort *)(local_378 + 6);
              iVar76 = (int)local_470;
              auVar129 = _DAT_001b1590;
              fVar128 = (float)local_468._0_4_;
              if (1 < (byte)local_318) {
                local_238[0].data = (uchar *)0x0;
                uVar75 = 0;
                if (uVar65 == 0) {
                  uVar65 = 0;
                }
                else {
                  uVar110 = (uint)uVar65;
                  puVar82 = local_390 +
                            (long)(int)((uint)uVar64 * (int)local_42c) +
                            (ulong)*(ushort *)(local_378 + 8);
                  iVar76 = (uint)uVar125 - local_488._0_4_;
                  uVar114 = iVar76 + 1;
                  uVar78 = (ulong)uVar114;
                  do {
                    uVar94 = local_318;
                    memset(local_238,0,local_318);
                    auVar129 = _DAT_001b1590;
                    uVar168 = local_488._0_4_;
                    uVar90 = uVar114;
                    switch((int)uVar94) {
                    case 2:
                      if (iVar76 < 0) {
LAB_00159b61:
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar105 = 0;
                        uVar94 = 0;
                        do {
                          bVar116 = puVar82[uVar105];
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 2 & 7)) =
                               bVar116;
                          uVar89 = (int)uVar94 + ((uint)bVar116 - (uint)bVar3);
                          uVar94 = (ulong)uVar89;
                          puVar82[uVar105] = (uchar)(uVar89 >> 1);
                          uVar105 = uVar105 + 1;
                        } while (uVar78 != uVar105);
                      }
                      break;
                    case 3:
                      if (iVar76 < 0) goto LAB_00159b61;
                      uVar105 = 0;
                      uVar94 = 0;
                      do {
                        bVar116 = puVar82[uVar105];
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 3 & 7)) =
                             bVar116;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                        puVar82[uVar105] = (uchar)(uVar94 / 3);
                        uVar105 = uVar105 + 1;
                      } while (uVar78 != uVar105);
                      break;
                    case 4:
                      if (iVar76 < 0) goto LAB_00159b61;
                      uVar105 = 0;
                      uVar94 = 0;
                      do {
                        bVar116 = puVar82[uVar105];
                        uVar104 = (ulong)((uint)uVar105 & 7);
                        bVar3 = *(byte *)((long)&local_238[0].data + uVar104);
                        *(byte *)((long)&local_238[0].data + (uVar104 ^ 4)) = bVar116;
                        uVar89 = (int)uVar94 + ((uint)bVar116 - (uint)bVar3);
                        uVar94 = (ulong)uVar89;
                        puVar82[uVar105] = (uchar)(uVar89 >> 2);
                        uVar105 = uVar105 + 1;
                      } while (uVar78 != uVar105);
                      break;
                    case 5:
                      if (iVar76 < 0) goto LAB_00159b61;
                      uVar105 = 0;
                      uVar94 = 0;
                      do {
                        bVar116 = puVar82[uVar105];
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 5 & 7)) =
                             bVar116;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                        puVar82[uVar105] = (uchar)(uVar94 / 5);
                        uVar105 = uVar105 + 1;
                      } while (uVar78 != uVar105);
                      break;
                    default:
                      if (iVar76 < 0) {
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar105 = 0;
                        uVar94 = 0;
                        do {
                          bVar116 = puVar82[uVar105];
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)(uVar168 + (uint)uVar105 & 7))
                               = bVar116;
                          uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                          puVar82[uVar105] = (uchar)(uVar94 / ((ulong)local_488 & 0xffffffff));
                          uVar105 = uVar105 + 1;
                        } while (uVar78 != uVar105);
                      }
                    }
                    if ((int)uVar90 < (int)(uint)uVar125) {
                      uVar105 = (ulong)uVar90;
                      do {
                        if (puVar82[uVar105] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar90 = (int)uVar94 -
                                 (uint)*(byte *)((long)&local_238[0].data +
                                                (ulong)((uint)uVar105 & 7));
                        uVar94 = (ulong)uVar90;
                        puVar82[uVar105] = (uchar)(uVar90 / (uint)uVar168);
                        uVar105 = uVar105 + 1;
                      } while ((int)uVar105 < (int)(uint)uVar125);
                    }
                    puVar82 = puVar82 + lVar115;
                    uVar75 = uVar75 + 1;
                  } while (uVar75 != uVar110);
                  uVar78 = (ulong)*(ushort *)(local_378 + 8);
                  uVar64 = *(ushort *)(local_378 + 10);
                  uVar110 = (uint)*(ushort *)(local_378 + 4);
                  uVar65 = *(ushort *)(local_378 + 6);
                  iVar76 = (int)local_470;
                  fVar128 = (float)local_468._0_4_;
                }
              }
              sVar88 = (short)uVar78;
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar75 = 0;
                if ((short)uVar110 == 0) {
                  uVar110 = 0;
                }
                else {
                  pbVar113 = local_390 + (long)(int)((uint)uVar64 * (int)local_42c) + uVar78;
                  iVar76 = (uint)uVar65 - iVar76;
                  uVar114 = iVar76 + 1;
                  uVar78 = (ulong)uVar114;
                  do {
                    uVar94 = local_320;
                    memset(local_238,0,local_320);
                    auVar129 = _DAT_001b1590;
                    uVar90 = uVar114;
                    switch((int)uVar94) {
                    case 2:
                      if (iVar76 < 0) {
LAB_00159fde:
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar105 = 0;
                        uVar94 = 0;
                        pbVar107 = pbVar113;
                        do {
                          bVar116 = *pbVar107;
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 2 & 7)) =
                               bVar116;
                          uVar89 = (int)uVar94 + ((uint)bVar116 - (uint)bVar3);
                          uVar94 = (ulong)uVar89;
                          *pbVar107 = (byte)(uVar89 >> 1);
                          uVar105 = uVar105 + 1;
                          pbVar107 = pbVar107 + lVar115;
                        } while (uVar78 != uVar105);
                      }
                      break;
                    case 3:
                      if (iVar76 < 0) goto LAB_00159fde;
                      uVar105 = 0;
                      uVar94 = 0;
                      pbVar107 = pbVar113;
                      do {
                        bVar116 = *pbVar107;
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 3 & 7)) =
                             bVar116;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                        *pbVar107 = (byte)(uVar94 / 3);
                        uVar105 = uVar105 + 1;
                        pbVar107 = pbVar107 + lVar115;
                      } while (uVar78 != uVar105);
                      break;
                    case 4:
                      if (iVar76 < 0) goto LAB_00159fde;
                      uVar105 = 0;
                      uVar94 = 0;
                      pbVar107 = pbVar113;
                      do {
                        bVar116 = *pbVar107;
                        uVar104 = (ulong)((uint)uVar105 & 7);
                        bVar3 = *(byte *)((long)&local_238[0].data + uVar104);
                        *(byte *)((long)&local_238[0].data + (uVar104 ^ 4)) = bVar116;
                        uVar89 = (int)uVar94 + ((uint)bVar116 - (uint)bVar3);
                        uVar94 = (ulong)uVar89;
                        *pbVar107 = (byte)(uVar89 >> 2);
                        uVar105 = uVar105 + 1;
                        pbVar107 = pbVar107 + lVar115;
                      } while (uVar78 != uVar105);
                      break;
                    case 5:
                      if (iVar76 < 0) goto LAB_00159fde;
                      uVar105 = 0;
                      uVar94 = 0;
                      pbVar107 = pbVar113;
                      do {
                        bVar116 = *pbVar107;
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 + 5 & 7)) =
                             bVar116;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                        *pbVar107 = (byte)(uVar94 / 5);
                        uVar105 = uVar105 + 1;
                        pbVar107 = pbVar107 + lVar115;
                      } while (uVar78 != uVar105);
                      break;
                    default:
                      if (iVar76 < 0) {
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar105 = 0;
                        uVar94 = 0;
                        pbVar107 = pbVar113;
                        do {
                          bVar116 = *pbVar107;
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar105 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_470 + (uint)uVar105 & 7)) = bVar116;
                          uVar94 = (ulong)((int)uVar94 + ((uint)bVar116 - (uint)bVar3));
                          *pbVar107 = (byte)(uVar94 / (local_470 & 0xffffffff));
                          uVar105 = uVar105 + 1;
                          pbVar107 = pbVar107 + lVar115;
                        } while (uVar78 != uVar105);
                      }
                    }
                    if ((int)uVar90 < (int)(uint)uVar65) {
                      lVar108 = (long)(int)uVar90;
                      pbVar107 = pbVar113 + lVar115 * lVar108;
                      do {
                        if (*pbVar107 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar94 = (ulong)((int)uVar94 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar108 & 7)));
                        *pbVar107 = (byte)(uVar94 / (local_470 & 0xffffffff));
                        lVar108 = lVar108 + 1;
                        pbVar107 = pbVar107 + lVar115;
                      } while ((uint)uVar65 != (uint)lVar108);
                    }
                    pbVar113 = pbVar113 + 1;
                    uVar75 = uVar75 + 1;
                  } while (uVar75 != uVar110);
                  sVar88 = *(short *)(local_378 + 8);
                  uVar64 = *(ushort *)(local_378 + 10);
                  uVar110 = (uint)*(ushort *)(local_378 + 4);
                  uVar65 = *(ushort *)(local_378 + 6);
                  fVar128 = (float)local_468._0_4_;
                }
              }
              *local_2d8 = sVar88;
              local_2d8[1] = uVar64;
              local_2d8[2] = sVar88 + (short)uVar110;
              local_2d8[3] = uVar65 + uVar64;
              *(float *)(local_2d8 + 8) =
                   (float)(int)(short)((short)(local_360 << 8) + (short)local_364) * fVar128;
              *(ulong *)(local_2d8 + 4) =
                   CONCAT44((float)local_354 * local_268._4_4_ + local_258._4_4_,
                            (float)local_350 * local_268._0_4_ + local_258._0_4_);
              *(float *)(local_2d8 + 10) =
                   (float)(int)(uVar110 + local_350) * local_268._0_4_ + local_258._0_4_;
              *(float *)(local_2d8 + 0xc) =
                   (float)(int)((uint)uVar65 + local_354) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar76 = local_3b8[1].fontstart;
              lVar108 = local_2e0;
              lVar97 = local_2d0;
              atlas_00 = local_478;
              psVar98 = local_3b8;
            }
            lVar97 = lVar97 + 1;
          } while (lVar97 < iVar76);
        }
        fVar128 = local_308[local_3c0].RasterizerMultiply;
        _local_488 = ZEXT416((uint)fVar128);
        if ((fVar128 != 1.0) || (NAN(fVar128))) {
          local_488._4_4_ = fVar128;
          local_488._0_4_ = fVar128;
          fStack_480 = fVar128;
          fStack_47c = fVar128;
          lVar108 = 0;
          uVar110 = 0xc;
          uVar75 = 0xd;
          uVar114 = 0xe;
          uVar90 = 0xf;
          auVar132 = _DAT_001b1520;
          auVar137 = _DAT_001b1510;
          auVar144 = _DAT_001b1500;
          do {
            uVar135 = auVar137._0_4_;
            uVar139 = auVar137._4_4_;
            uVar140 = auVar137._12_4_;
            uVar163 = auVar137._8_4_;
            uVar89 = auVar132._0_4_;
            uVar133 = auVar132._4_4_;
            uVar134 = auVar132._12_4_;
            uVar176 = auVar132._8_4_;
            uVar141 = auVar144._0_4_;
            uVar145 = auVar144._4_4_;
            uVar146 = auVar144._12_4_;
            uVar196 = auVar144._8_4_;
            fVar179 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar141 & 0xffff | 0x4b000000)) * fVar128;
            fVar183 = (((float)(uVar145 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar145 & 0xffff | 0x4b000000)) * fVar128;
            fVar184 = (((float)(uVar196 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar196 & 0xffff | 0x4b000000)) * fVar128;
            fVar185 = (((float)(uVar146 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar146 & 0xffff | 0x4b000000)) * fVar128;
            fVar167 = (((float)(uVar110 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar110 & 0xffff | 0x4b000000)) * fVar128;
            fVar175 = (((float)(uVar75 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar75 & 0xffff | 0x4b000000)) * fVar128;
            fVar177 = (((float)(uVar114 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar114 & 0xffff | 0x4b000000)) * fVar128;
            fVar178 = (((float)(uVar90 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar90 & 0xffff | 0x4b000000)) * fVar128;
            fVar157 = (((float)(uVar89 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar89 & 0xffff | 0x4b000000)) * fVar128;
            fVar162 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar133 & 0xffff | 0x4b000000)) * fVar128;
            fVar164 = (((float)(uVar176 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar176 & 0xffff | 0x4b000000)) * fVar128;
            fVar165 = (((float)(uVar134 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar134 & 0xffff | 0x4b000000)) * fVar128;
            fVar101 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar128;
            fVar153 = (((float)(uVar139 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar139 & 0xffff | 0x4b000000)) * fVar128;
            fVar154 = (((float)(uVar163 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar163 & 0xffff | 0x4b000000)) * fVar128;
            fVar155 = (((float)(uVar140 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar140 & 0xffff | 0x4b000000)) * fVar128;
            auVar152._0_4_ = (int)fVar101;
            auVar152._4_4_ = (int)fVar153;
            auVar152._8_4_ = (int)fVar154;
            auVar152._12_4_ = (int)fVar155;
            auVar197._0_4_ = auVar152._0_4_ >> 0x1f;
            auVar197._4_4_ = auVar152._4_4_ >> 0x1f;
            auVar197._8_4_ = auVar152._8_4_ >> 0x1f;
            auVar197._12_4_ = auVar152._12_4_ >> 0x1f;
            auVar151._0_4_ = (int)(fVar101 - 2.1474836e+09);
            auVar151._4_4_ = (int)(fVar153 - 2.1474836e+09);
            auVar151._8_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar151._12_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar152 = auVar151 & auVar197 | auVar152;
            auVar161._0_4_ = (int)fVar157;
            auVar161._4_4_ = (int)fVar162;
            auVar161._8_4_ = (int)fVar164;
            auVar161._12_4_ = (int)fVar165;
            auVar198._0_4_ = auVar161._0_4_ >> 0x1f;
            auVar198._4_4_ = auVar161._4_4_ >> 0x1f;
            auVar198._8_4_ = auVar161._8_4_ >> 0x1f;
            auVar198._12_4_ = auVar161._12_4_ >> 0x1f;
            auVar160._0_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar160._4_4_ = (int)(fVar162 - 2.1474836e+09);
            auVar160._8_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar160._12_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar161 = auVar160 & auVar198 | auVar161;
            auVar193._0_4_ = (int)fVar167;
            auVar193._4_4_ = (int)fVar175;
            auVar193._8_4_ = (int)fVar177;
            auVar193._12_4_ = (int)fVar178;
            auVar202._0_4_ = auVar193._0_4_ >> 0x1f;
            auVar202._4_4_ = auVar193._4_4_ >> 0x1f;
            auVar202._8_4_ = auVar193._8_4_ >> 0x1f;
            auVar202._12_4_ = auVar193._12_4_ >> 0x1f;
            auVar192._0_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar192._4_4_ = (int)(fVar175 - 2.1474836e+09);
            auVar192._8_4_ = (int)(fVar177 - 2.1474836e+09);
            auVar192._12_4_ = (int)(fVar178 - 2.1474836e+09);
            auVar193 = auVar192 & auVar202 | auVar193;
            auVar181._0_4_ = (int)fVar179;
            auVar181._4_4_ = (int)fVar183;
            auVar181._8_4_ = (int)fVar184;
            auVar181._12_4_ = (int)fVar185;
            auVar199._0_4_ = auVar181._0_4_ >> 0x1f;
            auVar199._4_4_ = auVar181._4_4_ >> 0x1f;
            auVar199._8_4_ = auVar181._8_4_ >> 0x1f;
            auVar199._12_4_ = auVar181._12_4_ >> 0x1f;
            auVar180._0_4_ = (int)(fVar179 - 2.1474836e+09);
            auVar180._4_4_ = (int)(fVar183 - 2.1474836e+09);
            auVar180._8_4_ = (int)(fVar184 - 2.1474836e+09);
            auVar180._12_4_ = (int)(fVar185 - 2.1474836e+09);
            auVar181 = auVar180 & auVar199 | auVar181;
            auVar200 = auVar181 ^ _DAT_001a7100;
            auVar173._0_4_ = -(uint)(auVar200._0_4_ < -0x7fffff01);
            auVar173._4_4_ = -(uint)(auVar200._4_4_ < -0x7fffff01);
            auVar173._8_4_ = -(uint)(auVar200._8_4_ < -0x7fffff01);
            auVar173._12_4_ = -(uint)(auVar200._12_4_ < -0x7fffff01);
            auVar200 = ~auVar173 & auVar129 | auVar181 & auVar173;
            auVar131 = auVar193 ^ _DAT_001a7100;
            auVar201._0_4_ = -(uint)(auVar131._0_4_ < -0x7fffff01);
            auVar201._4_4_ = -(uint)(auVar131._4_4_ < -0x7fffff01);
            auVar201._8_4_ = -(uint)(auVar131._8_4_ < -0x7fffff01);
            auVar201._12_4_ = -(uint)(auVar131._12_4_ < -0x7fffff01);
            auVar131 = ~auVar201 & auVar129 | auVar193 & auVar201;
            sVar88 = auVar200._0_2_;
            cVar13 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[0] - (0xff < sVar88);
            sVar88 = auVar200._2_2_;
            sVar166 = CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar200[2] - (0xff < sVar88),
                               cVar13);
            sVar88 = auVar200._4_2_;
            cVar123 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[4] - (0xff < sVar88);
            sVar88 = auVar200._6_2_;
            uVar168 = CONCAT13((0 < sVar88) * (sVar88 < 0x100) * auVar200[6] - (0xff < sVar88),
                               CONCAT12(cVar123,sVar166));
            sVar88 = auVar200._8_2_;
            cVar14 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[8] - (0xff < sVar88);
            sVar88 = auVar200._10_2_;
            uVar169 = CONCAT15((0 < sVar88) * (sVar88 < 0x100) * auVar200[10] - (0xff < sVar88),
                               CONCAT14(cVar14,uVar168));
            sVar88 = auVar200._12_2_;
            cVar15 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[0xc] - (0xff < sVar88);
            sVar88 = auVar200._14_2_;
            uVar170 = CONCAT17((0 < sVar88) * (sVar88 < 0x100) * auVar200[0xe] - (0xff < sVar88),
                               CONCAT16(cVar15,uVar169));
            sVar88 = auVar131._0_2_;
            cVar16 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[0] - (0xff < sVar88);
            sVar88 = auVar131._2_2_;
            auVar171._0_10_ =
                 CONCAT19((0 < sVar88) * (sVar88 < 0x100) * auVar131[2] - (0xff < sVar88),
                          CONCAT18(cVar16,uVar170));
            sVar88 = auVar131._4_2_;
            cVar17 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[4] - (0xff < sVar88);
            auVar171[10] = cVar17;
            sVar88 = auVar131._6_2_;
            auVar171[0xb] = (0 < sVar88) * (sVar88 < 0x100) * auVar131[6] - (0xff < sVar88);
            sVar88 = auVar131._8_2_;
            cVar126 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[8] - (0xff < sVar88);
            auVar172[0xc] = cVar126;
            auVar172._0_12_ = auVar171;
            sVar88 = auVar131._10_2_;
            auVar172[0xd] = (0 < sVar88) * (sVar88 < 0x100) * auVar131[10] - (0xff < sVar88);
            sVar88 = auVar131._12_2_;
            cVar124 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[0xc] - (0xff < sVar88);
            auVar174[0xe] = cVar124;
            auVar174._0_14_ = auVar172;
            sVar88 = auVar131._14_2_;
            auVar174[0xf] = (0 < sVar88) * (sVar88 < 0x100) * auVar131[0xe] - (0xff < sVar88);
            auVar200 = auVar161 ^ _DAT_001a7100;
            auVar194._0_4_ = -(uint)(auVar200._0_4_ < -0x7fffff01);
            auVar194._4_4_ = -(uint)(auVar200._4_4_ < -0x7fffff01);
            auVar194._8_4_ = -(uint)(auVar200._8_4_ < -0x7fffff01);
            auVar194._12_4_ = -(uint)(auVar200._12_4_ < -0x7fffff01);
            auVar131 = ~auVar194 & auVar129 | auVar161 & auVar194;
            auVar200 = auVar152 ^ _DAT_001a7100;
            auVar182._0_4_ = -(uint)(auVar200._0_4_ < -0x7fffff01);
            auVar182._4_4_ = -(uint)(auVar200._4_4_ < -0x7fffff01);
            auVar182._8_4_ = -(uint)(auVar200._8_4_ < -0x7fffff01);
            auVar182._12_4_ = -(uint)(auVar200._12_4_ < -0x7fffff01);
            auVar200 = ~auVar182 & auVar129 | auVar152 & auVar182;
            sVar88 = auVar131._0_2_;
            cVar18 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[0] - (0xff < sVar88);
            sVar88 = auVar131._2_2_;
            sVar186 = CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar131[2] - (0xff < sVar88),
                               cVar18);
            sVar88 = auVar131._4_2_;
            cVar19 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[4] - (0xff < sVar88);
            sVar88 = auVar131._6_2_;
            uVar187 = CONCAT13((0 < sVar88) * (sVar88 < 0x100) * auVar131[6] - (0xff < sVar88),
                               CONCAT12(cVar19,sVar186));
            sVar88 = auVar131._8_2_;
            cVar20 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[8] - (0xff < sVar88);
            sVar88 = auVar131._10_2_;
            uVar188 = CONCAT15((0 < sVar88) * (sVar88 < 0x100) * auVar131[10] - (0xff < sVar88),
                               CONCAT14(cVar20,uVar187));
            sVar88 = auVar131._12_2_;
            cVar21 = (0 < sVar88) * (sVar88 < 0x100) * auVar131[0xc] - (0xff < sVar88);
            sVar88 = auVar131._14_2_;
            uVar189 = CONCAT17((0 < sVar88) * (sVar88 < 0x100) * auVar131[0xe] - (0xff < sVar88),
                               CONCAT16(cVar21,uVar188));
            sVar88 = auVar200._0_2_;
            cVar22 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[0] - (0xff < sVar88);
            sVar88 = auVar200._2_2_;
            auVar190._0_10_ =
                 CONCAT19((0 < sVar88) * (sVar88 < 0x100) * auVar200[2] - (0xff < sVar88),
                          CONCAT18(cVar22,uVar189));
            sVar88 = auVar200._4_2_;
            cVar23 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[4] - (0xff < sVar88);
            auVar190[10] = cVar23;
            sVar88 = auVar200._6_2_;
            auVar190[0xb] = (0 < sVar88) * (sVar88 < 0x100) * auVar200[6] - (0xff < sVar88);
            sVar88 = auVar200._8_2_;
            cVar24 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[8] - (0xff < sVar88);
            auVar191[0xc] = cVar24;
            auVar191._0_12_ = auVar190;
            sVar88 = auVar200._10_2_;
            auVar191[0xd] = (0 < sVar88) * (sVar88 < 0x100) * auVar200[10] - (0xff < sVar88);
            sVar88 = auVar200._12_2_;
            cVar25 = (0 < sVar88) * (sVar88 < 0x100) * auVar200[0xc] - (0xff < sVar88);
            auVar195[0xe] = cVar25;
            auVar195._0_14_ = auVar191;
            sVar88 = auVar200._14_2_;
            auVar195[0xf] = (0 < sVar88) * (sVar88 < 0x100) * auVar200[0xe] - (0xff < sVar88);
            sVar88 = (short)((uint)uVar187 >> 0x10);
            sVar66 = (short)((uint6)uVar188 >> 0x20);
            sVar127 = (short)((ulong)uVar189 >> 0x30);
            sVar26 = (short)((unkuint10)auVar190._0_10_ >> 0x40);
            sVar27 = auVar190._10_2_;
            sVar28 = auVar191._12_2_;
            sVar29 = auVar195._14_2_;
            sVar30 = (short)((uint)uVar168 >> 0x10);
            sVar31 = (short)((uint6)uVar169 >> 0x20);
            sVar32 = (short)((ulong)uVar170 >> 0x30);
            sVar33 = (short)((unkuint10)auVar171._0_10_ >> 0x40);
            sVar34 = auVar171._10_2_;
            sVar35 = auVar172._12_2_;
            sVar36 = auVar174._14_2_;
            *(char *)((long)&local_238[0].data + lVar108) =
                 (0 < sVar186) * (sVar186 < 0x100) * cVar18 - (0xff < sVar186);
            *(char *)((long)&local_238[0].data + lVar108 + 1) =
                 (0 < sVar88) * (sVar88 < 0x100) * cVar19 - (0xff < sVar88);
            *(char *)((long)&local_238[0].data + lVar108 + 2) =
                 (0 < sVar66) * (sVar66 < 0x100) * cVar20 - (0xff < sVar66);
            *(char *)((long)&local_238[0].data + lVar108 + 3) =
                 (0 < sVar127) * (sVar127 < 0x100) * cVar21 - (0xff < sVar127);
            *(char *)((long)&local_238[0].data + lVar108 + 4) =
                 (0 < sVar26) * (sVar26 < 0x100) * cVar22 - (0xff < sVar26);
            *(char *)((long)&local_238[0].data + lVar108 + 5) =
                 (0 < sVar27) * (sVar27 < 0x100) * cVar23 - (0xff < sVar27);
            *(char *)((long)&local_238[0].data + lVar108 + 6) =
                 (0 < sVar28) * (sVar28 < 0x100) * cVar24 - (0xff < sVar28);
            *(char *)((long)&local_238[0].data + lVar108 + 7) =
                 (0 < sVar29) * (sVar29 < 0x100) * cVar25 - (0xff < sVar29);
            *(char *)((long)&local_238[0].cursor + lVar108) =
                 (0 < sVar166) * (sVar166 < 0x100) * cVar13 - (0xff < sVar166);
            *(char *)((long)&local_238[0].cursor + lVar108 + 1) =
                 (0 < sVar30) * (sVar30 < 0x100) * cVar123 - (0xff < sVar30);
            *(char *)((long)&local_238[0].cursor + lVar108 + 2) =
                 (0 < sVar31) * (sVar31 < 0x100) * cVar14 - (0xff < sVar31);
            *(char *)((long)&local_238[0].cursor + lVar108 + 3) =
                 (0 < sVar32) * (sVar32 < 0x100) * cVar15 - (0xff < sVar32);
            *(char *)((long)&local_238[0].size + lVar108) =
                 (0 < sVar33) * (sVar33 < 0x100) * cVar16 - (0xff < sVar33);
            *(char *)((long)&local_238[0].size + lVar108 + 1) =
                 (0 < sVar34) * (sVar34 < 0x100) * cVar17 - (0xff < sVar34);
            *(char *)((long)&local_238[0].size + lVar108 + 2) =
                 (0 < sVar35) * (sVar35 < 0x100) * cVar126 - (0xff < sVar35);
            *(char *)((long)&local_238[0].size + lVar108 + 3) =
                 (0 < sVar36) * (sVar36 < 0x100) * cVar124 - (0xff < sVar36);
            lVar108 = lVar108 + 0x10;
            iVar76 = (int)DAT_001b15a0;
            auVar132._0_4_ = uVar89 + iVar76;
            iVar93 = DAT_001b15a0._4_4_;
            auVar132._4_4_ = uVar133 + iVar93;
            iVar77 = DAT_001b15a0._8_4_;
            auVar132._8_4_ = uVar176 + iVar77;
            iVar156 = DAT_001b15a0._12_4_;
            auVar132._12_4_ = uVar134 + iVar156;
            auVar137._0_4_ = uVar135 + iVar76;
            auVar137._4_4_ = uVar139 + iVar93;
            auVar137._8_4_ = uVar163 + iVar77;
            auVar137._12_4_ = uVar140 + iVar156;
            auVar144._0_4_ = uVar141 + iVar76;
            auVar144._4_4_ = uVar145 + iVar93;
            auVar144._8_4_ = uVar196 + iVar77;
            auVar144._12_4_ = uVar146 + iVar156;
            uVar110 = uVar110 + iVar76;
            uVar75 = uVar75 + iVar93;
            uVar114 = uVar114 + iVar77;
            uVar90 = uVar90 + iVar156;
          } while (lVar108 != 0x100);
          iVar76 = psVar98[1].cff.cursor;
          if (0 < iVar76) {
            lVar97._0_4_ = psVar98[1].hmtx;
            lVar97._4_4_ = psVar98[1].kern;
            iVar93 = 0;
            do {
              if ((*(int *)(lVar97 + 0xc) != 0) && (*(ushort *)(lVar97 + 6) != 0)) {
                iVar76 = atlas_00->TexWidth;
                uVar64 = *(ushort *)(lVar97 + 4);
                puVar82 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar97 + 10) * (long)iVar76 +
                          (ulong)*(ushort *)(lVar97 + 8);
                uVar110 = (uint)*(ushort *)(lVar97 + 6);
                do {
                  if ((ulong)uVar64 != 0) {
                    uVar78 = 0;
                    do {
                      puVar82[uVar78] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar82[uVar78]);
                      uVar78 = uVar78 + 1;
                    } while (uVar64 != uVar78);
                  }
                  puVar82 = puVar82 + iVar76;
                  bVar63 = 1 < (int)uVar110;
                  uVar110 = uVar110 - 1;
                } while (bVar63);
                iVar76 = psVar98[1].cff.cursor;
              }
              iVar93 = iVar93 + 1;
              lVar97 = lVar97 + 0x10;
            } while (iVar93 < iVar76);
          }
        }
        psVar98[1].hmtx = 0;
        psVar98[1].kern = 0;
      }
      lVar108 = local_3c0 + 1;
    } while (lVar108 != lVar91);
  }
  ImGui::MemFree(local_440);
  ImGui::MemFree(local_330);
  pvVar81 = pvStack_3f0;
  if (pvStack_3f0 != (void *)0x0) {
    auVar54._8_8_ = 0;
    auVar54._0_8_ = pvStack_3f0;
    _local_3f8 = (stbtt__buf)(auVar54 << 0x40);
    ImGui::MemFree(pvVar81);
    pvStack_3f0._0_4_ = 0;
    pvStack_3f0._4_4_ = 0;
  }
  if ((int)uVar8 < 1) {
    if (local_4d8 == (void *)0x0) goto LAB_0015a8d2;
  }
  else {
    lVar108 = 0;
    auVar122._0_12_ = DAT_001b15d0._0_12_;
    auVar122._12_2_ = DAT_001b15d0._6_2_;
    auVar122._14_2_ = DAT_001b15d0._6_2_;
    auVar121._12_4_ = auVar122._12_4_;
    auVar121._0_10_ = (unkbyte10)DAT_001b15d0;
    auVar121._10_2_ = DAT_001b15d0._4_2_;
    auVar120._10_6_ = auVar121._10_6_;
    auVar120._0_8_ = (undefined8)DAT_001b15d0;
    auVar120._8_2_ = DAT_001b15d0._4_2_;
    local_498._8_8_ = auVar120._8_8_;
    local_498._6_2_ = DAT_001b15d0._2_2_;
    local_498._4_2_ = DAT_001b15d0._2_2_;
    local_498._0_2_ = (undefined2)DAT_001b15d0;
    local_498._2_2_ = local_498._0_2_;
    do {
      uVar168 = (undefined4)lVar108;
      uVar187 = (undefined4)((ulong)lVar108 >> 0x20);
      lVar115 = lVar108 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar115 + 0xe8);
      if (iVar76 != 0) {
        if ((local_478->ConfigData).Size <= lVar108) goto LAB_0015aa20;
        pIVar12 = (local_478->ConfigData).Data;
        pIVar99 = pIVar12 + lVar108;
        pIVar9 = pIVar12[lVar108].DstFont;
        if (pIVar12[lVar108].MergeMode == true) {
          uVar7 = pIVar9->ConfigDataCount;
          sVar88 = uVar7 + 1;
          fVar128 = pIVar9->Ascent;
        }
        else {
          _local_488 = ZEXT416((uint)pIVar12[lVar108].SizePixels);
          lVar108 = *(long *)((long)local_4d8 + lVar115 + 8);
          lVar97 = (long)*(int *)((long)local_4d8 + lVar115 + 0x24);
          bVar116 = *(byte *)(lVar108 + 4 + lVar97);
          bVar3 = *(byte *)(lVar108 + 5 + lVar97);
          bVar4 = *(byte *)(lVar108 + 7 + lVar97);
          bVar5 = *(byte *)(lVar108 + 6 + lVar97);
          ImFont::ClearOutputData(pIVar9);
          iVar76 = (uint)bVar5 * 0x100 + (uint)bVar116;
          auVar43._1_9_ = (unkuint9)0 << 8;
          auVar43[0] = (char)((uint)iVar76 >> 0x10);
          auVar43._10_6_ = 0;
          auVar58._1_12_ = SUB1612(auVar43 << 0x28,4);
          auVar58[0] = (char)((uint)iVar76 >> 8);
          auVar58[0xd] = 0;
          auVar59._1_14_ = auVar58 << 8;
          auVar59[0] = (char)iVar76;
          auVar59[0xf] = 0;
          auVar129 = ZEXT416((uint)bVar3 | (uint)bVar4 << 0x10) | auVar59 << 8;
          sVar66 = auVar129._0_2_;
          sVar88 = auVar129._2_2_;
          fVar101 = (float)((int)sVar66 - (int)sVar88);
          sVar127 = auVar129._4_2_;
          auVar60._4_6_ = 0;
          auVar60._0_4_ = fVar101;
          auVar60._10_2_ = sVar127;
          auVar61._8_4_ = auVar60._8_4_;
          auVar61._6_2_ = sVar88;
          auVar61._4_2_ = (short)((uint)fVar101 >> 0x10);
          auVar61._0_4_ = fVar101;
          auVar138._0_2_ = -(ushort)(sVar66 < (short)local_498._0_2_);
          auVar138._2_2_ = -(ushort)(sVar66 < (short)local_498._2_2_);
          auVar138._4_2_ = -(ushort)(sVar88 < (short)local_498._4_2_);
          auVar138._6_2_ = -(ushort)(sVar88 < (short)local_498._6_2_);
          auVar138._8_2_ = -(ushort)(sVar127 < (short)local_498._8_2_);
          auVar138._10_2_ = -(ushort)(sVar127 < (short)local_498._10_2_);
          auVar138._12_2_ = -(ushort)(0 < (short)local_498._12_2_);
          auVar138._14_2_ = -(ushort)(0 < (short)local_498._14_2_);
          auVar129 = auVar138 & _DAT_001a7170 | ~auVar138 & _DAT_001a7120;
          fVar128 = (float)(int)(((float)local_488._0_4_ / fVar101) * (float)(int)sVar66 +
                                auVar129._0_4_);
          pIVar9->FontSize = pIVar99->SizePixels;
          pIVar9->ConfigData = pIVar99;
          pIVar9->ContainerAtlas = local_478;
          pIVar9->Ascent = fVar128;
          pIVar9->Descent =
               (float)(int)(((float)local_488._0_4_ / fVar101) * (float)(auVar61._4_4_ >> 0x10) +
                           auVar129._4_4_);
          iVar76 = *(int *)((long)local_4d8 + lVar115 + 0xe8);
          sVar88 = 1;
        }
        pIVar9->ConfigDataCount = sVar88;
        if (0 < iVar76) {
          local_488._0_4_ = (pIVar99->GlyphOffset).x;
          fVar128 = (float)(int)(fVar128 + 0.5) + (pIVar99->GlyphOffset).y;
          lVar97 = 0;
          lVar108 = 0;
          do {
            if (*(int *)((long)local_4d8 + lVar115 + 0x100) <= lVar108) goto LAB_0015a966;
            lVar95 = *(long *)((long)local_4d8 + lVar115 + 0xd0);
            fVar153 = 1.0 / (float)local_478->TexHeight;
            fVar101 = 1.0 / (float)local_478->TexWidth;
            ImFont::AddGlyph(pIVar9,pIVar99,
                             *(ImWchar *)
                              (*(long *)((long)local_4d8 + lVar115 + 0x108) + lVar108 * 4),
                             *(float *)(lVar95 + 8 + lVar97) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar95 + 0xc + lVar97) + 0.0 + fVar128,
                             *(float *)(lVar95 + 0x14 + lVar97) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar95 + 0x18 + lVar97) + 0.0 + fVar128,
                             (float)*(ushort *)(lVar95 + lVar97) * fVar101,
                             (float)*(ushort *)(lVar95 + 2 + lVar97) * fVar153,
                             (float)*(ushort *)(lVar95 + 4 + lVar97) * fVar101,
                             (float)*(ushort *)(lVar95 + 6 + lVar97) * fVar153,
                             *(float *)(lVar95 + 0x10 + lVar97));
            lVar108 = lVar108 + 1;
            lVar97 = lVar97 + 0x1c;
          } while (lVar108 < *(int *)((long)local_4d8 + lVar115 + 0xe8));
        }
      }
      atlas_00 = local_478;
      lVar108 = CONCAT44(uVar187,uVar168) + 1;
    } while (lVar108 != lVar91);
    if (0 < (int)uVar8) {
      sVar100 = 0;
      do {
        pvVar81 = *(void **)((long)local_4d8 + sVar100 + 0x108);
        if (pvVar81 != (void *)0x0) {
          ImGui::MemFree(pvVar81);
        }
        pvVar81 = *(void **)((long)local_4d8 + sVar100 + 0xf8);
        if (pvVar81 != (void *)0x0) {
          ImGui::MemFree(pvVar81);
        }
        sVar100 = sVar100 + 0x110;
      } while (local_310 != sVar100);
    }
  }
  ImGui::MemFree(local_4d8);
LAB_0015a8d2:
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  return true;
LAB_0015aab6:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0015a97b;
LAB_0015aa20:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0015a97b;
LAB_0015a966:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0015a97b:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}